

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::sse2::CurveNiIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined6 uVar31;
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  int iVar47;
  undefined4 uVar48;
  ulong uVar49;
  long lVar50;
  RayHit *extraout_RAX;
  RayHit *extraout_RAX_00;
  RayHit *extraout_RAX_01;
  RayHit *extraout_RAX_02;
  RayHit *pRVar51;
  undefined4 uVar53;
  RayHit *extraout_RAX_03;
  RayHit *extraout_RAX_04;
  RayHit *extraout_RAX_05;
  RayHit *extraout_RAX_06;
  RayHit *pRVar52;
  ulong uVar54;
  RTCIntersectArguments *pRVar55;
  ulong uVar56;
  long lVar57;
  bool bVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  short sVar67;
  float fVar68;
  float fVar107;
  float fVar108;
  __m128 a_1;
  undefined2 uVar106;
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar109;
  float fVar125;
  float fVar126;
  vfloat4 v;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar127;
  float fVar128;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar142;
  float fVar154;
  float fVar155;
  vfloat4 v_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar156;
  float fVar175;
  float fVar176;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar177;
  float fVar187;
  float fVar188;
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar189;
  float fVar196;
  float fVar197;
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar198;
  float fVar224;
  float fVar225;
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar226;
  float fVar240;
  float fVar241;
  undefined1 auVar227 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar236 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar242;
  float fVar253;
  float fVar254;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar255;
  float fVar258;
  float fVar259;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar260;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  vfloat4 a;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar285;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  vfloatx u_outer1;
  vfloatx u_outer0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  undefined4 local_59c;
  undefined1 local_598 [16];
  RTCIntersectArguments *local_580;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  ulong local_500;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  RTCFilterFunctionNArguments local_4e8;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  ulong local_4a0;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined8 local_458;
  float fStack_450;
  float fStack_44c;
  undefined4 local_448;
  uint local_444;
  uint local_440;
  uint local_43c;
  uint local_438;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  ulong local_330;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  float local_2b8 [4];
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  Primitive *local_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint auStack_f8 [4];
  float afStack_e8 [6];
  float afStack_d0 [40];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 uVar105;
  undefined1 auVar131 [16];
  undefined1 auVar134 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [16];
  
  PVar6 = prim[1];
  uVar54 = (ulong)(byte)PVar6;
  pPVar5 = prim + uVar54 * 0x19 + 6;
  fVar126 = *(float *)(pPVar5 + 0xc);
  fVar142 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar5) * fVar126;
  fVar154 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar5 + 4)) * fVar126;
  fVar155 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar5 + 8)) * fVar126;
  fVar109 = fVar126 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar125 = fVar126 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar126 = fVar126 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar53 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar105 = (undefined1)((uint)uVar53 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar53 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar53));
  uVar105 = (undefined1)((uint)uVar53 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar105),uVar105);
  sVar67 = CONCAT11((char)uVar53,(char)uVar53);
  uVar56 = CONCAT62(uVar31,sVar67);
  auVar244._8_4_ = 0;
  auVar244._0_8_ = uVar56;
  auVar244._12_2_ = uVar106;
  auVar244._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar218._12_4_ = auVar244._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar56;
  auVar218._10_2_ = uVar106;
  auVar263._10_6_ = auVar218._10_6_;
  auVar263._8_2_ = uVar106;
  auVar263._0_8_ = uVar56;
  uVar106 = (undefined2)uVar31;
  auVar32._4_8_ = auVar263._8_8_;
  auVar32._2_2_ = uVar106;
  auVar32._0_2_ = uVar106;
  fVar127 = (float)((int)sVar67 >> 8);
  fVar139 = (float)(auVar32._0_4_ >> 0x18);
  fVar140 = (float)(auVar263._8_4_ >> 0x18);
  uVar53 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar105 = (undefined1)((uint)uVar53 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar53 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar53));
  uVar105 = (undefined1)((uint)uVar53 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar105),uVar105);
  sVar67 = CONCAT11((char)uVar53,(char)uVar53);
  uVar56 = CONCAT62(uVar31,sVar67);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar56;
  auVar71._12_2_ = uVar106;
  auVar71._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar56;
  auVar70._10_2_ = uVar106;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._8_2_ = uVar106;
  auVar69._0_8_ = uVar56;
  uVar106 = (undefined2)uVar31;
  auVar33._4_8_ = auVar69._8_8_;
  auVar33._2_2_ = uVar106;
  auVar33._0_2_ = uVar106;
  fVar156 = (float)((int)sVar67 >> 8);
  fVar175 = (float)(auVar33._0_4_ >> 0x18);
  fVar176 = (float)(auVar69._8_4_ >> 0x18);
  uVar53 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar105 = (undefined1)((uint)uVar53 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar53 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar53));
  uVar105 = (undefined1)((uint)uVar53 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar105),uVar105);
  sVar67 = CONCAT11((char)uVar53,(char)uVar53);
  uVar56 = CONCAT62(uVar31,sVar67);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar56;
  auVar74._12_2_ = uVar106;
  auVar74._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar56;
  auVar73._10_2_ = uVar106;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar106;
  auVar72._0_8_ = uVar56;
  uVar106 = (undefined2)uVar31;
  auVar34._4_8_ = auVar72._8_8_;
  auVar34._2_2_ = uVar106;
  auVar34._0_2_ = uVar106;
  fVar177 = (float)((int)sVar67 >> 8);
  fVar187 = (float)(auVar34._0_4_ >> 0x18);
  fVar188 = (float)(auVar72._8_4_ >> 0x18);
  uVar53 = *(undefined4 *)(prim + uVar54 * 0xb + 6);
  uVar105 = (undefined1)((uint)uVar53 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar53 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar53));
  uVar105 = (undefined1)((uint)uVar53 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar105),uVar105);
  sVar67 = CONCAT11((char)uVar53,(char)uVar53);
  uVar56 = CONCAT62(uVar31,sVar67);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar56;
  auVar77._12_2_ = uVar106;
  auVar77._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar56;
  auVar76._10_2_ = uVar106;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar106;
  auVar75._0_8_ = uVar56;
  uVar106 = (undefined2)uVar31;
  auVar35._4_8_ = auVar75._8_8_;
  auVar35._2_2_ = uVar106;
  auVar35._0_2_ = uVar106;
  fVar68 = (float)((int)sVar67 >> 8);
  fVar107 = (float)(auVar35._0_4_ >> 0x18);
  fVar108 = (float)(auVar75._8_4_ >> 0x18);
  uVar53 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  uVar105 = (undefined1)((uint)uVar53 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar53 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar53));
  uVar105 = (undefined1)((uint)uVar53 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar105),uVar105);
  sVar67 = CONCAT11((char)uVar53,(char)uVar53);
  uVar56 = CONCAT62(uVar31,sVar67);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar56;
  auVar192._12_2_ = uVar106;
  auVar192._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar56;
  auVar191._10_2_ = uVar106;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar106;
  auVar190._0_8_ = uVar56;
  uVar106 = (undefined2)uVar31;
  auVar36._4_8_ = auVar190._8_8_;
  auVar36._2_2_ = uVar106;
  auVar36._0_2_ = uVar106;
  fVar189 = (float)((int)sVar67 >> 8);
  fVar196 = (float)(auVar36._0_4_ >> 0x18);
  fVar197 = (float)(auVar190._8_4_ >> 0x18);
  uVar53 = *(undefined4 *)(prim + (uint)(byte)PVar6 * 0xc + uVar54 + 6);
  uVar105 = (undefined1)((uint)uVar53 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar53 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar53));
  uVar105 = (undefined1)((uint)uVar53 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar105),uVar105);
  sVar67 = CONCAT11((char)uVar53,(char)uVar53);
  uVar56 = CONCAT62(uVar31,sVar67);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar56;
  auVar201._12_2_ = uVar106;
  auVar201._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar56;
  auVar200._10_2_ = uVar106;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar106;
  auVar199._0_8_ = uVar56;
  uVar106 = (undefined2)uVar31;
  auVar37._4_8_ = auVar199._8_8_;
  auVar37._2_2_ = uVar106;
  auVar37._0_2_ = uVar106;
  fVar242 = (float)((int)sVar67 >> 8);
  fVar253 = (float)(auVar37._0_4_ >> 0x18);
  fVar254 = (float)(auVar199._8_4_ >> 0x18);
  uVar49 = (ulong)(uint)((int)(uVar54 * 9) * 2);
  uVar53 = *(undefined4 *)(prim + uVar49 + 6);
  uVar105 = (undefined1)((uint)uVar53 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar53 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar53));
  uVar105 = (undefined1)((uint)uVar53 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar105),uVar105);
  sVar67 = CONCAT11((char)uVar53,(char)uVar53);
  uVar56 = CONCAT62(uVar31,sVar67);
  auVar204._8_4_ = 0;
  auVar204._0_8_ = uVar56;
  auVar204._12_2_ = uVar106;
  auVar204._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar203._12_4_ = auVar204._12_4_;
  auVar203._8_2_ = 0;
  auVar203._0_8_ = uVar56;
  auVar203._10_2_ = uVar106;
  auVar202._10_6_ = auVar203._10_6_;
  auVar202._8_2_ = uVar106;
  auVar202._0_8_ = uVar56;
  uVar106 = (undefined2)uVar31;
  auVar38._4_8_ = auVar202._8_8_;
  auVar38._2_2_ = uVar106;
  auVar38._0_2_ = uVar106;
  fVar226 = (float)((int)sVar67 >> 8);
  fVar240 = (float)(auVar38._0_4_ >> 0x18);
  fVar241 = (float)(auVar202._8_4_ >> 0x18);
  uVar53 = *(undefined4 *)(prim + uVar49 + uVar54 + 6);
  uVar105 = (undefined1)((uint)uVar53 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar53 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar53));
  uVar105 = (undefined1)((uint)uVar53 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar105),uVar105);
  sVar67 = CONCAT11((char)uVar53,(char)uVar53);
  uVar56 = CONCAT62(uVar31,sVar67);
  auVar207._8_4_ = 0;
  auVar207._0_8_ = uVar56;
  auVar207._12_2_ = uVar106;
  auVar207._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar206._12_4_ = auVar207._12_4_;
  auVar206._8_2_ = 0;
  auVar206._0_8_ = uVar56;
  auVar206._10_2_ = uVar106;
  auVar205._10_6_ = auVar206._10_6_;
  auVar205._8_2_ = uVar106;
  auVar205._0_8_ = uVar56;
  uVar106 = (undefined2)uVar31;
  auVar39._4_8_ = auVar205._8_8_;
  auVar39._2_2_ = uVar106;
  auVar39._0_2_ = uVar106;
  fVar255 = (float)((int)sVar67 >> 8);
  fVar258 = (float)(auVar39._0_4_ >> 0x18);
  fVar259 = (float)(auVar205._8_4_ >> 0x18);
  uVar49 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar53 = *(undefined4 *)(prim + uVar49 + 6);
  uVar105 = (undefined1)((uint)uVar53 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar53 >> 0x10);
  uVar17 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar53));
  uVar105 = (undefined1)((uint)uVar53 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar17 >> 0x20),uVar105),uVar105);
  sVar67 = CONCAT11((char)uVar53,(char)uVar53);
  uVar56 = CONCAT62(uVar31,sVar67);
  auVar210._8_4_ = 0;
  auVar210._0_8_ = uVar56;
  auVar210._12_2_ = uVar106;
  auVar210._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar17 >> 0x20);
  auVar209._12_4_ = auVar210._12_4_;
  auVar209._8_2_ = 0;
  auVar209._0_8_ = uVar56;
  auVar209._10_2_ = uVar106;
  auVar208._10_6_ = auVar209._10_6_;
  auVar208._8_2_ = uVar106;
  auVar208._0_8_ = uVar56;
  uVar106 = (undefined2)uVar31;
  auVar40._4_8_ = auVar208._8_8_;
  auVar40._2_2_ = uVar106;
  auVar40._0_2_ = uVar106;
  fVar276 = (float)((int)sVar67 >> 8);
  fVar280 = (float)(auVar40._0_4_ >> 0x18);
  fVar282 = (float)(auVar208._8_4_ >> 0x18);
  fVar268 = fVar109 * fVar127 + fVar125 * fVar156 + fVar126 * fVar177;
  fVar270 = fVar109 * fVar139 + fVar125 * fVar175 + fVar126 * fVar187;
  fVar272 = fVar109 * fVar140 + fVar125 * fVar176 + fVar126 * fVar188;
  fVar274 = fVar109 * (float)(auVar218._12_4_ >> 0x18) +
            fVar125 * (float)(auVar70._12_4_ >> 0x18) + fVar126 * (float)(auVar73._12_4_ >> 0x18);
  fVar260 = fVar109 * fVar68 + fVar125 * fVar189 + fVar126 * fVar242;
  fVar265 = fVar109 * fVar107 + fVar125 * fVar196 + fVar126 * fVar253;
  fVar266 = fVar109 * fVar108 + fVar125 * fVar197 + fVar126 * fVar254;
  fVar267 = fVar109 * (float)(auVar76._12_4_ >> 0x18) +
            fVar125 * (float)(auVar191._12_4_ >> 0x18) + fVar126 * (float)(auVar200._12_4_ >> 0x18);
  fVar198 = fVar109 * fVar226 + fVar125 * fVar255 + fVar126 * fVar276;
  fVar224 = fVar109 * fVar240 + fVar125 * fVar258 + fVar126 * fVar280;
  fVar225 = fVar109 * fVar241 + fVar125 * fVar259 + fVar126 * fVar282;
  fVar109 = fVar109 * (float)(auVar203._12_4_ >> 0x18) +
            fVar125 * (float)(auVar206._12_4_ >> 0x18) + fVar126 * (float)(auVar209._12_4_ >> 0x18);
  fVar128 = fVar127 * fVar142 + fVar156 * fVar154 + fVar177 * fVar155;
  fVar187 = fVar139 * fVar142 + fVar175 * fVar154 + fVar187 * fVar155;
  fVar188 = fVar140 * fVar142 + fVar176 * fVar154 + fVar188 * fVar155;
  fVar141 = (float)(auVar218._12_4_ >> 0x18) * fVar142 +
            (float)(auVar70._12_4_ >> 0x18) * fVar154 + (float)(auVar73._12_4_ >> 0x18) * fVar155;
  fVar189 = fVar68 * fVar142 + fVar189 * fVar154 + fVar242 * fVar155;
  fVar196 = fVar107 * fVar142 + fVar196 * fVar154 + fVar253 * fVar155;
  fVar197 = fVar108 * fVar142 + fVar197 * fVar154 + fVar254 * fVar155;
  fVar242 = (float)(auVar76._12_4_ >> 0x18) * fVar142 +
            (float)(auVar191._12_4_ >> 0x18) * fVar154 + (float)(auVar200._12_4_ >> 0x18) * fVar155;
  fVar156 = fVar142 * fVar226 + fVar154 * fVar255 + fVar155 * fVar276;
  fVar175 = fVar142 * fVar240 + fVar154 * fVar258 + fVar155 * fVar280;
  fVar176 = fVar142 * fVar241 + fVar154 * fVar259 + fVar155 * fVar282;
  fVar177 = fVar142 * (float)(auVar203._12_4_ >> 0x18) +
            fVar154 * (float)(auVar206._12_4_ >> 0x18) + fVar155 * (float)(auVar209._12_4_ >> 0x18);
  fVar126 = (float)DAT_01ff1d40;
  fVar68 = DAT_01ff1d40._4_4_;
  fVar107 = DAT_01ff1d40._8_4_;
  fVar108 = DAT_01ff1d40._12_4_;
  uVar59 = -(uint)(fVar126 <= ABS(fVar268));
  uVar61 = -(uint)(fVar68 <= ABS(fVar270));
  uVar63 = -(uint)(fVar107 <= ABS(fVar272));
  uVar65 = -(uint)(fVar108 <= ABS(fVar274));
  auVar143._0_4_ = ~uVar59 & (uint)fVar126;
  auVar143._4_4_ = ~uVar61 & (uint)fVar68;
  auVar143._8_4_ = ~uVar63 & (uint)fVar107;
  auVar143._12_4_ = ~uVar65 & (uint)fVar108;
  auVar78._4_4_ = (uint)fVar270 & uVar61;
  auVar78._0_4_ = (uint)fVar268 & uVar59;
  auVar78._8_4_ = (uint)fVar272 & uVar63;
  auVar78._12_4_ = (uint)fVar274 & uVar65;
  auVar143 = auVar143 | auVar78;
  uVar59 = -(uint)(fVar126 <= ABS(fVar260));
  uVar61 = -(uint)(fVar68 <= ABS(fVar265));
  uVar63 = -(uint)(fVar107 <= ABS(fVar266));
  uVar65 = -(uint)(fVar108 <= ABS(fVar267));
  auVar261._0_4_ = (uint)fVar260 & uVar59;
  auVar261._4_4_ = (uint)fVar265 & uVar61;
  auVar261._8_4_ = (uint)fVar266 & uVar63;
  auVar261._12_4_ = (uint)fVar267 & uVar65;
  auVar157._0_4_ = ~uVar59 & (uint)fVar126;
  auVar157._4_4_ = ~uVar61 & (uint)fVar68;
  auVar157._8_4_ = ~uVar63 & (uint)fVar107;
  auVar157._12_4_ = ~uVar65 & (uint)fVar108;
  auVar157 = auVar157 | auVar261;
  uVar59 = -(uint)(fVar126 <= ABS(fVar198));
  uVar61 = -(uint)(fVar68 <= ABS(fVar224));
  uVar63 = -(uint)(fVar107 <= ABS(fVar225));
  uVar65 = -(uint)(fVar108 <= ABS(fVar109));
  auVar211._0_4_ = (uint)fVar198 & uVar59;
  auVar211._4_4_ = (uint)fVar224 & uVar61;
  auVar211._8_4_ = (uint)fVar225 & uVar63;
  auVar211._12_4_ = (uint)fVar109 & uVar65;
  auVar193._0_4_ = ~uVar59 & (uint)fVar126;
  auVar193._4_4_ = ~uVar61 & (uint)fVar68;
  auVar193._8_4_ = ~uVar63 & (uint)fVar107;
  auVar193._12_4_ = ~uVar65 & (uint)fVar108;
  auVar193 = auVar193 | auVar211;
  auVar78 = rcpps(_DAT_01ff1d40,auVar143);
  fVar126 = auVar78._0_4_;
  fVar108 = auVar78._4_4_;
  fVar127 = auVar78._8_4_;
  fVar142 = auVar78._12_4_;
  fVar126 = (1.0 - auVar143._0_4_ * fVar126) * fVar126 + fVar126;
  fVar108 = (1.0 - auVar143._4_4_ * fVar108) * fVar108 + fVar108;
  fVar127 = (1.0 - auVar143._8_4_ * fVar127) * fVar127 + fVar127;
  fVar142 = (1.0 - auVar143._12_4_ * fVar142) * fVar142 + fVar142;
  auVar78 = rcpps(auVar78,auVar157);
  fVar68 = auVar78._0_4_;
  fVar109 = auVar78._4_4_;
  fVar139 = auVar78._8_4_;
  fVar154 = auVar78._12_4_;
  fVar68 = (1.0 - auVar157._0_4_ * fVar68) * fVar68 + fVar68;
  fVar109 = (1.0 - auVar157._4_4_ * fVar109) * fVar109 + fVar109;
  fVar139 = (1.0 - auVar157._8_4_ * fVar139) * fVar139 + fVar139;
  fVar154 = (1.0 - auVar157._12_4_ * fVar154) * fVar154 + fVar154;
  auVar78 = rcpps(auVar78,auVar193);
  fVar107 = auVar78._0_4_;
  fVar125 = auVar78._4_4_;
  fVar140 = auVar78._8_4_;
  fVar155 = auVar78._12_4_;
  fVar107 = (1.0 - auVar193._0_4_ * fVar107) * fVar107 + fVar107;
  fVar125 = (1.0 - auVar193._4_4_ * fVar125) * fVar125 + fVar125;
  fVar140 = (1.0 - auVar193._8_4_ * fVar140) * fVar140 + fVar140;
  fVar155 = (1.0 - auVar193._12_4_ * fVar155) * fVar155 + fVar155;
  uVar56 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar106 = (undefined2)(uVar56 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar56;
  auVar81._12_2_ = uVar106;
  auVar81._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar56 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar56;
  auVar80._10_2_ = uVar106;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar106;
  auVar79._0_8_ = uVar56;
  uVar106 = (undefined2)(uVar56 >> 0x10);
  auVar41._4_8_ = auVar79._8_8_;
  auVar41._2_2_ = uVar106;
  auVar41._0_2_ = uVar106;
  auVar144._0_8_ =
       CONCAT44(((float)(auVar41._0_4_ >> 0x10) - fVar187) * fVar108,
                ((float)(int)(short)uVar56 - fVar128) * fVar126);
  auVar144._8_4_ = ((float)(auVar79._8_4_ >> 0x10) - fVar188) * fVar127;
  auVar144._12_4_ = ((float)(auVar80._12_4_ >> 0x10) - fVar141) * fVar142;
  uVar56 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar106 = (undefined2)(uVar56 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar56;
  auVar84._12_2_ = uVar106;
  auVar84._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar56 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar56;
  auVar83._10_2_ = uVar106;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar106;
  auVar82._0_8_ = uVar56;
  uVar106 = (undefined2)(uVar56 >> 0x10);
  auVar42._4_8_ = auVar82._8_8_;
  auVar42._2_2_ = uVar106;
  auVar42._0_2_ = uVar106;
  auVar194._0_4_ = ((float)(int)(short)uVar56 - fVar128) * fVar126;
  auVar194._4_4_ = ((float)(auVar42._0_4_ >> 0x10) - fVar187) * fVar108;
  auVar194._8_4_ = ((float)(auVar82._8_4_ >> 0x10) - fVar188) * fVar127;
  auVar194._12_4_ = ((float)(auVar83._12_4_ >> 0x10) - fVar141) * fVar142;
  lVar50 = uVar49 + uVar54;
  uVar56 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  uVar49 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar54 * -2 + 6);
  uVar106 = (undefined2)(uVar49 >> 0x30);
  auVar214._8_4_ = 0;
  auVar214._0_8_ = uVar49;
  auVar214._12_2_ = uVar106;
  auVar214._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar49 >> 0x20);
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._8_2_ = 0;
  auVar213._0_8_ = uVar49;
  auVar213._10_2_ = uVar106;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._8_2_ = uVar106;
  auVar212._0_8_ = uVar49;
  uVar106 = (undefined2)(uVar49 >> 0x10);
  auVar43._4_8_ = auVar212._8_8_;
  auVar43._2_2_ = uVar106;
  auVar43._0_2_ = uVar106;
  auVar215._0_8_ =
       CONCAT44(((float)(auVar43._0_4_ >> 0x10) - fVar196) * fVar109,
                ((float)(int)(short)uVar49 - fVar189) * fVar68);
  auVar215._8_4_ = ((float)(auVar212._8_4_ >> 0x10) - fVar197) * fVar139;
  auVar215._12_4_ = ((float)(auVar213._12_4_ >> 0x10) - fVar242) * fVar154;
  uVar106 = (undefined2)(uVar56 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar56;
  auVar87._12_2_ = uVar106;
  auVar87._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar56 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar56;
  auVar86._10_2_ = uVar106;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar106;
  auVar85._0_8_ = uVar56;
  uVar106 = (undefined2)(uVar56 >> 0x10);
  auVar44._4_8_ = auVar85._8_8_;
  auVar44._2_2_ = uVar106;
  auVar44._0_2_ = uVar106;
  auVar88._0_4_ = ((float)(int)(short)uVar56 - fVar189) * fVar68;
  auVar88._4_4_ = ((float)(auVar44._0_4_ >> 0x10) - fVar196) * fVar109;
  auVar88._8_4_ = ((float)(auVar85._8_4_ >> 0x10) - fVar197) * fVar139;
  auVar88._12_4_ = ((float)(auVar86._12_4_ >> 0x10) - fVar242) * fVar154;
  uVar56 = *(ulong *)(prim + lVar50 + 6);
  uVar106 = (undefined2)(uVar56 >> 0x30);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar56;
  auVar180._12_2_ = uVar106;
  auVar180._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar56 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar56;
  auVar179._10_2_ = uVar106;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar106;
  auVar178._0_8_ = uVar56;
  uVar106 = (undefined2)(uVar56 >> 0x10);
  auVar45._4_8_ = auVar178._8_8_;
  auVar45._2_2_ = uVar106;
  auVar45._0_2_ = uVar106;
  auVar181._0_8_ =
       CONCAT44(((float)(auVar45._0_4_ >> 0x10) - fVar175) * fVar125,
                ((float)(int)(short)uVar56 - fVar156) * fVar107);
  auVar181._8_4_ = ((float)(auVar178._8_4_ >> 0x10) - fVar176) * fVar140;
  auVar181._12_4_ = ((float)(auVar179._12_4_ >> 0x10) - fVar177) * fVar155;
  uVar56 = *(ulong *)(prim + uVar54 * 0x17 + 6);
  uVar106 = (undefined2)(uVar56 >> 0x30);
  auVar229._8_4_ = 0;
  auVar229._0_8_ = uVar56;
  auVar229._12_2_ = uVar106;
  auVar229._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar56 >> 0x20);
  auVar228._12_4_ = auVar229._12_4_;
  auVar228._8_2_ = 0;
  auVar228._0_8_ = uVar56;
  auVar228._10_2_ = uVar106;
  auVar227._10_6_ = auVar228._10_6_;
  auVar227._8_2_ = uVar106;
  auVar227._0_8_ = uVar56;
  uVar106 = (undefined2)(uVar56 >> 0x10);
  auVar46._4_8_ = auVar227._8_8_;
  auVar46._2_2_ = uVar106;
  auVar46._0_2_ = uVar106;
  auVar230._0_4_ = ((float)(int)(short)uVar56 - fVar156) * fVar107;
  auVar230._4_4_ = ((float)(auVar46._0_4_ >> 0x10) - fVar175) * fVar125;
  auVar230._8_4_ = ((float)(auVar227._8_4_ >> 0x10) - fVar176) * fVar140;
  auVar230._12_4_ = ((float)(auVar228._12_4_ >> 0x10) - fVar177) * fVar155;
  auVar243._8_4_ = auVar144._8_4_;
  auVar243._0_8_ = auVar144._0_8_;
  auVar243._12_4_ = auVar144._12_4_;
  auVar244 = minps(auVar243,auVar194);
  auVar110._8_4_ = auVar215._8_4_;
  auVar110._0_8_ = auVar215._0_8_;
  auVar110._12_4_ = auVar215._12_4_;
  auVar78 = minps(auVar110,auVar88);
  auVar244 = maxps(auVar244,auVar78);
  auVar111._8_4_ = auVar181._8_4_;
  auVar111._0_8_ = auVar181._0_8_;
  auVar111._12_4_ = auVar181._12_4_;
  auVar78 = minps(auVar111,auVar230);
  uVar53 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar158._4_4_ = uVar53;
  auVar158._0_4_ = uVar53;
  auVar158._8_4_ = uVar53;
  auVar158._12_4_ = uVar53;
  auVar78 = maxps(auVar78,auVar158);
  auVar78 = maxps(auVar244,auVar78);
  local_238 = auVar78._0_4_ * 0.99999964;
  fStack_234 = auVar78._4_4_ * 0.99999964;
  fStack_230 = auVar78._8_4_ * 0.99999964;
  fStack_22c = auVar78._12_4_ * 0.99999964;
  auVar78 = maxps(auVar144,auVar194);
  auVar244 = maxps(auVar215,auVar88);
  auVar78 = minps(auVar78,auVar244);
  auVar244 = maxps(auVar181,auVar230);
  fVar126 = (ray->super_RayK<1>).tfar;
  auVar89._4_4_ = fVar126;
  auVar89._0_4_ = fVar126;
  auVar89._8_4_ = fVar126;
  auVar89._12_4_ = fVar126;
  auVar244 = minps(auVar244,auVar89);
  auVar78 = minps(auVar78,auVar244);
  auVar112._0_4_ = -(uint)(PVar6 != (Primitive)0x0 && local_238 <= auVar78._0_4_ * 1.0000004);
  auVar112._4_4_ = -(uint)(1 < (byte)PVar6 && fStack_234 <= auVar78._4_4_ * 1.0000004);
  auVar112._8_4_ = -(uint)(2 < (byte)PVar6 && fStack_230 <= auVar78._8_4_ * 1.0000004);
  auVar112._12_4_ = -(uint)(3 < (byte)PVar6 && fStack_22c <= auVar78._12_4_ * 1.0000004);
  uVar59 = movmskps((int)lVar50,auVar112);
  if (uVar59 == 0) {
    return;
  }
  uVar59 = uVar59 & 0xff;
  local_218._0_12_ = mm_lookupmask_ps._240_12_;
  local_218._12_4_ = 0;
  local_290 = prim;
LAB_00b75144:
  local_330 = (ulong)uVar59;
  lVar50 = 0;
  if (local_330 != 0) {
    for (; (uVar59 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
    }
  }
  local_330 = local_330 - 1 & local_330;
  local_580 = (RTCIntersectArguments *)(ulong)*(uint *)(local_290 + 2);
  local_500 = (ulong)*(uint *)(local_290 + lVar50 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[(long)local_580].ptr;
  pRVar55 = (RTCIntersectArguments *)
            pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 + (long)pRVar55 * local_500);
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar50 = 0;
  if (local_330 != 0) {
    for (; (local_330 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
    }
  }
  lVar50 = *(long *)&pGVar7[1].time_range.upper;
  pfVar1 = (float *)(lVar50 + (long)p_Var8 * uVar56);
  pfVar2 = (float *)(lVar50 + (uVar56 + 1) * (long)p_Var8);
  pfVar3 = (float *)(lVar50 + (uVar56 + 2) * (long)p_Var8);
  pfVar4 = (float *)(lVar50 + (uVar56 + 3) * (long)p_Var8);
  if ((local_330 != 0) && (uVar56 = local_330 - 1 & local_330, uVar56 != 0)) {
    lVar57 = 0;
    if (uVar56 != 0) {
      for (; (uVar56 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
      }
    }
    pRVar55 = (RTCIntersectArguments *)
              ((long)pRVar55 * (ulong)*(uint *)(local_290 + lVar57 * 4 + 6));
  }
  local_488 = (ray->super_RayK<1>).org.field_0.m128[0];
  fStack_484 = (ray->super_RayK<1>).org.field_0.m128[1];
  fStack_480 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_318 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_3e8 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_3d8 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar126 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fStack_11c = local_318 * local_318;
  fVar107 = local_3e8 * local_3e8;
  fVar108 = local_3d8 * local_3d8;
  fVar126 = fVar126 * fVar126;
  fVar68 = fStack_11c + fVar107 + fVar108;
  auVar159._0_8_ = CONCAT44(fVar107 + fVar107 + fVar126,fVar68);
  auVar159._8_4_ = fVar108 + fVar107 + fVar108;
  auVar159._12_4_ = fVar126 + fVar107 + fVar126;
  auVar145._8_4_ = auVar159._8_4_;
  auVar145._0_8_ = auVar159._0_8_;
  auVar145._12_4_ = auVar159._12_4_;
  auVar78 = rcpss(auVar145,auVar159);
  local_3a8 = (2.0 - fVar68 * auVar78._0_4_) * auVar78._0_4_ *
              (((pfVar1[2] + pfVar2[2] + pfVar3[2] + pfVar4[2]) * 0.25 - fStack_480) * local_3d8 +
              ((pfVar1[1] + pfVar2[1] + pfVar3[1] + pfVar4[1]) * 0.25 - fStack_484) * local_3e8 +
              ((*pfVar1 + *pfVar2 + *pfVar3 + *pfVar4) * 0.25 - local_488) * local_318);
  local_2c8 = ZEXT416((uint)local_3a8);
  fStack_3a4 = local_3a8;
  fStack_3a0 = local_3a8;
  fStack_39c = local_3a8;
  local_488 = local_318 * local_3a8 + local_488;
  fStack_484 = local_3e8 * local_3a8 + fStack_484;
  fStack_480 = local_3d8 * local_3a8 + fStack_480;
  local_4f8 = *pfVar1 - local_488;
  fStack_4f4 = pfVar1[1] - fStack_484;
  fStack_4f0 = pfVar1[2] - fStack_480;
  fStack_4ec = pfVar1[3] - 0.0;
  local_478 = *pfVar3 - local_488;
  fStack_474 = pfVar3[1] - fStack_484;
  fStack_470 = pfVar3[2] - fStack_480;
  fStack_46c = pfVar3[3] - 0.0;
  local_468 = *pfVar2 - local_488;
  fStack_464 = pfVar2[1] - fStack_484;
  fStack_460 = pfVar2[2] - fStack_480;
  fStack_45c = pfVar2[3] - 0.0;
  local_488 = *pfVar4 - local_488;
  fStack_484 = pfVar4[1] - fStack_484;
  fStack_480 = pfVar4[2] - fStack_480;
  fStack_47c = pfVar4[3] - 0.0;
  local_138 = local_4f8;
  fStack_134 = local_4f8;
  fStack_130 = local_4f8;
  fStack_12c = local_4f8;
  local_148 = fStack_4f4;
  fStack_144 = fStack_4f4;
  fStack_140 = fStack_4f4;
  fStack_13c = fStack_4f4;
  local_158 = fStack_4f0;
  fStack_154 = fStack_4f0;
  fStack_150 = fStack_4f0;
  fStack_14c = fStack_4f0;
  local_168 = fStack_4ec;
  fStack_164 = fStack_4ec;
  fStack_160 = fStack_4ec;
  fStack_15c = fStack_4ec;
  local_178 = local_468;
  fStack_174 = local_468;
  fStack_170 = local_468;
  fStack_16c = local_468;
  local_188 = fStack_464;
  fStack_184 = fStack_464;
  fStack_180 = fStack_464;
  fStack_17c = fStack_464;
  local_198 = fStack_460;
  fStack_194 = fStack_460;
  fStack_190 = fStack_460;
  fStack_18c = fStack_460;
  local_1a8 = fStack_45c;
  fStack_1a4 = fStack_45c;
  fStack_1a0 = fStack_45c;
  fStack_19c = fStack_45c;
  local_1b8 = local_478;
  fStack_1b4 = local_478;
  fStack_1b0 = local_478;
  fStack_1ac = local_478;
  local_1c8 = fStack_474;
  fStack_1c4 = fStack_474;
  fStack_1c0 = fStack_474;
  fStack_1bc = fStack_474;
  local_268 = fStack_470;
  fStack_264 = fStack_470;
  fStack_260 = fStack_470;
  fStack_25c = fStack_470;
  local_128 = fStack_11c + fVar108 + fVar107;
  fStack_124 = fStack_11c + fVar108 + fVar107;
  fStack_120 = fStack_11c + fVar108 + fVar107;
  fStack_11c = fStack_11c + fVar108 + fVar107;
  local_278 = fStack_46c;
  fStack_274 = fStack_46c;
  fStack_270 = fStack_46c;
  fStack_26c = fStack_46c;
  local_1d8 = local_488;
  fStack_1d4 = local_488;
  fStack_1d0 = local_488;
  fStack_1cc = local_488;
  local_1e8 = fStack_484;
  fStack_1e4 = fStack_484;
  fStack_1e0 = fStack_484;
  fStack_1dc = fStack_484;
  local_1f8 = fStack_480;
  fStack_1f4 = fStack_480;
  fStack_1f0 = fStack_480;
  fStack_1ec = fStack_480;
  local_208 = fStack_47c;
  fStack_204 = fStack_47c;
  fStack_200 = fStack_47c;
  fStack_1fc = fStack_47c;
  fStack_314 = local_318;
  fStack_310 = local_318;
  fStack_30c = local_318;
  fStack_3e4 = local_3e8;
  fStack_3e0 = local_3e8;
  fStack_3dc = local_3e8;
  fStack_3d4 = local_3d8;
  fStack_3d0 = local_3d8;
  fStack_3cc = local_3d8;
  local_288 = ABS(local_128);
  fStack_284 = ABS(fStack_124);
  fStack_280 = ABS(fStack_120);
  fStack_27c = ABS(fStack_11c);
  uVar56 = 1;
  local_4a0 = 1;
  local_3f8 = 0.0;
  fStack_3f4 = 1.0;
  uStack_3f0 = 0;
  uStack_3ec = 0;
  uVar49 = 0;
  do {
    local_368 = fStack_3f4 - local_3f8;
    fStack_364 = local_368;
    fStack_360 = local_368;
    fStack_35c = local_368;
    local_378 = local_3f8;
    fStack_374 = local_3f8;
    fStack_370 = local_3f8;
    fStack_36c = local_3f8;
    fVar68 = local_368 * 0.0 + local_3f8;
    fVar107 = local_368 * 0.33333334 + local_3f8;
    fVar108 = local_368 * 0.6666667 + local_3f8;
    fVar109 = local_368 * 1.0 + local_3f8;
    fVar242 = (float)DAT_01feca10;
    fVar253 = fVar242 - fVar68;
    fVar254 = DAT_01feca10._4_4_;
    fVar255 = fVar254 - fVar107;
    fVar258 = DAT_01feca10._8_4_;
    fVar265 = DAT_01feca10._12_4_;
    fVar259 = fVar258 - fVar108;
    fVar260 = fVar265 - fVar109;
    fVar125 = local_178 * fVar253 + local_1b8 * fVar68;
    fVar267 = fStack_174 * fVar255 + fStack_1b4 * fVar107;
    fVar268 = fStack_170 * fVar259 + fStack_1b0 * fVar108;
    fVar270 = fStack_16c * fVar260 + fStack_1ac * fVar109;
    fVar272 = local_188 * fVar253 + local_1c8 * fVar68;
    fVar274 = fStack_184 * fVar255 + fStack_1c4 * fVar107;
    fVar276 = fStack_180 * fVar259 + fStack_1c0 * fVar108;
    fVar280 = fStack_17c * fVar260 + fStack_1bc * fVar109;
    fVar126 = local_198 * fVar253 + local_268 * fVar68;
    fVar127 = fStack_194 * fVar255 + fStack_264 * fVar107;
    fVar139 = fStack_190 * fVar259 + fStack_260 * fVar108;
    fVar140 = fStack_18c * fVar260 + fStack_25c * fVar109;
    fVar225 = local_1a8 * fVar253 + local_278 * fVar68;
    fVar226 = fStack_1a4 * fVar255 + fStack_274 * fVar107;
    fVar240 = fStack_1a0 * fVar259 + fStack_270 * fVar108;
    fVar241 = fStack_19c * fVar260 + fStack_26c * fVar109;
    fVar142 = (local_138 * fVar253 + local_178 * fVar68) * fVar253 + fVar68 * fVar125;
    fVar154 = (fStack_134 * fVar255 + fStack_174 * fVar107) * fVar255 + fVar107 * fVar267;
    fVar155 = (fStack_130 * fVar259 + fStack_170 * fVar108) * fVar259 + fVar108 * fVar268;
    fVar156 = (fStack_12c * fVar260 + fStack_16c * fVar109) * fVar260 + fVar109 * fVar270;
    fVar175 = (local_148 * fVar253 + local_188 * fVar68) * fVar253 + fVar68 * fVar272;
    fVar176 = (fStack_144 * fVar255 + fStack_184 * fVar107) * fVar255 + fVar107 * fVar274;
    fVar177 = (fStack_140 * fVar259 + fStack_180 * fVar108) * fVar259 + fVar108 * fVar276;
    fVar128 = (fStack_13c * fVar260 + fStack_17c * fVar109) * fVar260 + fVar109 * fVar280;
    fVar187 = (local_158 * fVar253 + local_198 * fVar68) * fVar253 + fVar68 * fVar126;
    fVar188 = (fStack_154 * fVar255 + fStack_194 * fVar107) * fVar255 + fVar107 * fVar127;
    fVar141 = (fStack_150 * fVar259 + fStack_190 * fVar108) * fVar259 + fVar108 * fVar139;
    fVar189 = (fStack_14c * fVar260 + fStack_18c * fVar109) * fVar260 + fVar109 * fVar140;
    fVar196 = (local_168 * fVar253 + local_1a8 * fVar68) * fVar253 + fVar68 * fVar225;
    fVar197 = (fStack_164 * fVar255 + fStack_1a4 * fVar107) * fVar255 + fVar107 * fVar226;
    fVar198 = (fStack_160 * fVar259 + fStack_1a0 * fVar108) * fVar259 + fVar108 * fVar240;
    fVar224 = (fStack_15c * fVar260 + fStack_19c * fVar109) * fVar260 + fVar109 * fVar241;
    fVar266 = fVar125 * fVar253 + (local_1b8 * fVar253 + local_1d8 * fVar68) * fVar68;
    fVar267 = fVar267 * fVar255 + (fStack_1b4 * fVar255 + fStack_1d4 * fVar107) * fVar107;
    fVar268 = fVar268 * fVar259 + (fStack_1b0 * fVar259 + fStack_1d0 * fVar108) * fVar108;
    fVar270 = fVar270 * fVar260 + (fStack_1ac * fVar260 + fStack_1cc * fVar109) * fVar109;
    fVar272 = fVar272 * fVar253 + (local_1c8 * fVar253 + local_1e8 * fVar68) * fVar68;
    fVar274 = fVar274 * fVar255 + (fStack_1c4 * fVar255 + fStack_1e4 * fVar107) * fVar107;
    fVar276 = fVar276 * fVar259 + (fStack_1c0 * fVar259 + fStack_1e0 * fVar108) * fVar108;
    fVar280 = fVar280 * fVar260 + (fStack_1bc * fVar260 + fStack_1dc * fVar109) * fVar109;
    fVar125 = fVar126 * fVar253 + (local_268 * fVar253 + local_1f8 * fVar68) * fVar68;
    fVar127 = fVar127 * fVar255 + (fStack_264 * fVar255 + fStack_1f4 * fVar107) * fVar107;
    fVar139 = fVar139 * fVar259 + (fStack_260 * fVar259 + fStack_1f0 * fVar108) * fVar108;
    fVar140 = fVar140 * fVar260 + (fStack_25c * fVar260 + fStack_1ec * fVar109) * fVar109;
    fVar225 = fVar225 * fVar253 + (local_278 * fVar253 + local_208 * fVar68) * fVar68;
    fVar226 = fVar226 * fVar255 + (fStack_274 * fVar255 + fStack_204 * fVar107) * fVar107;
    fVar240 = fVar240 * fVar259 + (fStack_270 * fVar259 + fStack_200 * fVar108) * fVar108;
    fVar241 = fVar241 * fVar260 + (fStack_26c * fVar260 + fStack_1fc * fVar109) * fVar109;
    fVar277 = fVar253 * fVar142 + fVar68 * fVar266;
    fVar281 = fVar255 * fVar154 + fVar107 * fVar267;
    fVar283 = fVar259 * fVar155 + fVar108 * fVar268;
    fVar284 = fVar260 * fVar156 + fVar109 * fVar270;
    fVar285 = fVar253 * fVar175 + fVar68 * fVar272;
    fVar289 = fVar255 * fVar176 + fVar107 * fVar274;
    fVar290 = fVar259 * fVar177 + fVar108 * fVar276;
    fVar291 = fVar260 * fVar128 + fVar109 * fVar280;
    fVar269 = fVar253 * fVar187 + fVar68 * fVar125;
    fVar271 = fVar255 * fVar188 + fVar107 * fVar127;
    fVar273 = fVar259 * fVar141 + fVar108 * fVar139;
    fVar275 = fVar260 * fVar189 + fVar109 * fVar140;
    fVar126 = local_368 * 0.11111111;
    fVar282 = fVar253 * fVar196 + fVar68 * fVar225;
    fVar255 = fVar255 * fVar197 + fVar107 * fVar226;
    auVar262._0_8_ = CONCAT44(fVar255,fVar282);
    auVar262._8_4_ = fVar259 * fVar198 + fVar108 * fVar240;
    auVar262._12_4_ = fVar260 * fVar224 + fVar109 * fVar241;
    local_558 = (fVar266 - fVar142) * 3.0 * fVar126;
    local_518 = (fVar267 - fVar154) * 3.0 * fVar126;
    fStack_514 = (fVar268 - fVar155) * 3.0 * fVar126;
    fStack_510 = (fVar270 - fVar156) * 3.0 * fVar126;
    fVar253 = (fVar272 - fVar175) * 3.0 * fVar126;
    local_528 = (fVar274 - fVar176) * 3.0 * fVar126;
    fStack_524 = (fVar276 - fVar177) * 3.0 * fVar126;
    fStack_520 = (fVar280 - fVar128) * 3.0 * fVar126;
    local_4b8 = (fVar125 - fVar187) * 3.0 * fVar126;
    local_538 = (fVar127 - fVar188) * 3.0 * fVar126;
    fStack_534 = (fVar139 - fVar141) * 3.0 * fVar126;
    fStack_530 = (fVar140 - fVar189) * 3.0 * fVar126;
    fVar68 = fVar126 * (fVar226 - fVar197) * 3.0;
    fVar107 = fVar126 * (fVar240 - fVar198) * 3.0;
    fVar108 = fVar126 * (fVar241 - fVar224) * 3.0;
    local_578._4_4_ = fVar283;
    local_578._0_4_ = fVar281;
    fStack_570 = fVar284;
    fStack_56c = 0.0;
    local_348._4_4_ = fVar290;
    local_348._0_4_ = fVar289;
    fStack_340 = fVar291;
    fStack_33c = 0.0;
    auVar160._4_4_ = auVar262._8_4_;
    auVar160._0_4_ = fVar255;
    auVar160._8_4_ = auVar262._12_4_;
    auVar160._12_4_ = 0;
    local_5b8._4_4_ = fVar255 + fVar68;
    local_5b8._0_4_ = fVar282 + fVar126 * (fVar225 - fVar196) * 3.0;
    fStack_5b0 = auVar262._8_4_ + fVar107;
    fStack_5ac = auVar262._12_4_ + fVar108;
    auVar113._0_8_ = CONCAT44(auVar262._8_4_ - fVar107,fVar255 - fVar68);
    auVar113._8_4_ = auVar262._12_4_ - fVar108;
    auVar113._12_4_ = 0;
    local_398 = fVar289 - fVar285;
    fStack_394 = fVar290 - fVar289;
    fStack_390 = fVar291 - fVar290;
    fStack_38c = 0.0 - fVar291;
    local_598._4_4_ = fVar273;
    local_598._0_4_ = fVar271;
    local_598._8_4_ = fVar275;
    local_598._12_4_ = 0;
    local_3c8 = fVar271 - fVar269;
    fStack_3c4 = fVar273 - fVar271;
    fStack_3c0 = fVar275 - fVar273;
    fStack_3bc = 0.0 - fVar275;
    fVar126 = fVar253 * local_3c8 - local_4b8 * local_398;
    fVar68 = local_528 * fStack_3c4 - local_538 * fStack_394;
    fVar107 = fStack_524 * fStack_3c0 - fStack_534 * fStack_390;
    fVar108 = fStack_520 * fStack_3bc - fStack_530 * fStack_38c;
    local_408._0_4_ = fVar281 - fVar277;
    local_408._4_4_ = fVar283 - fVar281;
    fStack_400 = fVar284 - fVar283;
    fStack_3fc = 0.0 - fVar284;
    fVar109 = local_4b8 * (float)local_408._0_4_ - local_558 * local_3c8;
    fVar127 = local_538 * (float)local_408._4_4_ - local_518 * fStack_3c4;
    fVar140 = fStack_534 * fStack_400 - fStack_514 * fStack_3c0;
    fVar154 = fStack_530 * fStack_3fc - fStack_510 * fStack_3bc;
    fVar125 = local_558 * local_398 - fVar253 * (float)local_408._0_4_;
    fVar139 = local_518 * fStack_394 - local_528 * (float)local_408._4_4_;
    fVar142 = fStack_514 * fStack_390 - fStack_524 * fStack_400;
    fVar155 = fStack_510 * fStack_38c - fStack_520 * fStack_3fc;
    auVar216._0_4_ = fVar125 * fVar125;
    auVar216._4_4_ = fVar139 * fVar139;
    auVar216._8_4_ = fVar142 * fVar142;
    auVar216._12_4_ = fVar155 * fVar155;
    auVar146._0_4_ =
         (float)local_408._0_4_ * (float)local_408._0_4_ +
         local_398 * local_398 + local_3c8 * local_3c8;
    auVar146._4_4_ =
         (float)local_408._4_4_ * (float)local_408._4_4_ +
         fStack_394 * fStack_394 + fStack_3c4 * fStack_3c4;
    auVar146._8_4_ = fStack_400 * fStack_400 + fStack_390 * fStack_390 + fStack_3c0 * fStack_3c0;
    auVar146._12_4_ = fStack_3fc * fStack_3fc + fStack_38c * fStack_38c + fStack_3bc * fStack_3bc;
    auVar78 = rcpps(auVar216,auVar146);
    fVar125 = auVar78._0_4_;
    fVar139 = auVar78._4_4_;
    fVar142 = auVar78._8_4_;
    fVar155 = auVar78._12_4_;
    fVar125 = (1.0 - fVar125 * auVar146._0_4_) * fVar125 + fVar125;
    fVar139 = (1.0 - fVar139 * auVar146._4_4_) * fVar139 + fVar139;
    fVar142 = (1.0 - fVar142 * auVar146._8_4_) * fVar142 + fVar142;
    fVar155 = (1.0 - fVar155 * auVar146._12_4_) * fVar155 + fVar155;
    fVar156 = local_3c8 * local_528 - local_398 * local_538;
    fVar175 = fStack_3c4 * fStack_524 - fStack_394 * fStack_534;
    fVar176 = fStack_3c0 * fStack_520 - fStack_390 * fStack_530;
    fVar177 = fStack_3bc * 0.0 - fStack_38c * 0.0;
    fStack_52c = 0.0;
    fVar128 = (float)local_408._0_4_ * local_538 - local_3c8 * local_518;
    fVar187 = (float)local_408._4_4_ * fStack_534 - fStack_3c4 * fStack_514;
    fVar188 = fStack_400 * fStack_530 - fStack_3c0 * fStack_510;
    fVar141 = fStack_3fc * 0.0 - fStack_3bc * 0.0;
    fStack_51c = 0.0;
    fStack_50c = 0.0;
    fVar189 = local_398 * local_518 - (float)local_408._0_4_ * local_528;
    fVar196 = fStack_394 * fStack_514 - (float)local_408._4_4_ * fStack_524;
    fVar197 = fStack_390 * fStack_510 - fStack_400 * fStack_520;
    fVar198 = fStack_38c * 0.0 - fStack_3fc * 0.0;
    auVar278._0_4_ = fVar189 * fVar189;
    auVar278._4_4_ = fVar196 * fVar196;
    auVar278._8_4_ = fVar197 * fVar197;
    auVar278._12_4_ = fVar198 * fVar198;
    auVar90._0_4_ = (fVar126 * fVar126 + fVar109 * fVar109 + auVar216._0_4_) * fVar125;
    auVar90._4_4_ = (fVar68 * fVar68 + fVar127 * fVar127 + auVar216._4_4_) * fVar139;
    auVar90._8_4_ = (fVar107 * fVar107 + fVar140 * fVar140 + auVar216._8_4_) * fVar142;
    auVar90._12_4_ = (fVar108 * fVar108 + fVar154 * fVar154 + auVar216._12_4_) * fVar155;
    auVar231._0_4_ = (fVar156 * fVar156 + fVar128 * fVar128 + auVar278._0_4_) * fVar125;
    auVar231._4_4_ = (fVar175 * fVar175 + fVar187 * fVar187 + auVar278._4_4_) * fVar139;
    auVar231._8_4_ = (fVar176 * fVar176 + fVar188 * fVar188 + auVar278._8_4_) * fVar142;
    auVar231._12_4_ = (fVar177 * fVar177 + fVar141 * fVar141 + auVar278._12_4_) * fVar155;
    auVar78 = maxps(auVar90,auVar231);
    auVar217._8_4_ = auVar262._8_4_;
    auVar217._0_8_ = auVar262._0_8_;
    auVar217._12_4_ = auVar262._12_4_;
    auVar218 = maxps(auVar217,_local_5b8);
    auVar182._8_4_ = auVar113._8_4_;
    auVar182._0_8_ = auVar113._0_8_;
    auVar182._12_4_ = 0;
    auVar244 = maxps(auVar182,auVar160);
    auVar218 = maxps(auVar218,auVar244);
    auVar263 = minps(auVar262,_local_5b8);
    auVar244 = minps(auVar113,auVar160);
    auVar244 = minps(auVar263,auVar244);
    auVar78 = sqrtps(auVar78,auVar78);
    auVar263 = rsqrtps(auVar278,auVar146);
    fVar126 = auVar263._0_4_;
    fVar68 = auVar263._4_4_;
    fVar107 = auVar263._8_4_;
    fVar108 = auVar263._12_4_;
    local_2e8 = fVar126 * fVar126 * auVar146._0_4_ * -0.5 * fVar126 + fVar126 * 1.5;
    fStack_2e4 = fVar68 * fVar68 * auVar146._4_4_ * -0.5 * fVar68 + fVar68 * 1.5;
    fStack_2e0 = fVar107 * fVar107 * auVar146._8_4_ * -0.5 * fVar107 + fVar107 * 1.5;
    fStack_2dc = fVar108 * fVar108 * auVar146._12_4_ * -0.5 * fVar108 + fVar108 * 1.5;
    local_358 = 0.0 - fVar285;
    fStack_354 = 0.0 - fVar289;
    fStack_350 = 0.0 - fVar290;
    fStack_34c = 0.0 - fVar291;
    fVar126 = 0.0 - fVar269;
    fVar68 = 0.0 - fVar271;
    fVar107 = 0.0 - fVar273;
    fVar108 = 0.0 - fVar275;
    fVar109 = 0.0 - fVar277;
    fVar125 = 0.0 - fVar281;
    fVar127 = 0.0 - fVar283;
    fVar139 = 0.0 - fVar284;
    local_418._0_4_ =
         local_318 * (float)local_408._0_4_ * local_2e8 +
         local_3e8 * local_398 * local_2e8 + local_3d8 * local_3c8 * local_2e8;
    local_418._4_4_ =
         fStack_314 * (float)local_408._4_4_ * fStack_2e4 +
         fStack_3e4 * fStack_394 * fStack_2e4 + fStack_3d4 * fStack_3c4 * fStack_2e4;
    fStack_410 = fStack_310 * fStack_400 * fStack_2e0 +
                 fStack_3e0 * fStack_390 * fStack_2e0 + fStack_3d0 * fStack_3c0 * fStack_2e0;
    fStack_40c = fStack_30c * fStack_3fc * fStack_2dc +
                 fStack_3dc * fStack_38c * fStack_2dc + fStack_3cc * fStack_3bc * fStack_2dc;
    auVar286._0_4_ = local_398 * local_2e8 * local_358 + local_3c8 * local_2e8 * fVar126;
    auVar286._4_4_ = fStack_394 * fStack_2e4 * fStack_354 + fStack_3c4 * fStack_2e4 * fVar68;
    auVar286._8_4_ = fStack_390 * fStack_2e0 * fStack_350 + fStack_3c0 * fStack_2e0 * fVar107;
    auVar286._12_4_ = fStack_38c * fStack_2dc * fStack_34c + fStack_3bc * fStack_2dc * fVar108;
    local_2d8._0_4_ = (float)local_408._0_4_ * local_2e8 * fVar109 + auVar286._0_4_;
    local_2d8._4_4_ = (float)local_408._4_4_ * fStack_2e4 * fVar125 + auVar286._4_4_;
    fStack_2d0 = fStack_400 * fStack_2e0 * fVar127 + auVar286._8_4_;
    fStack_2cc = fStack_3fc * fStack_2dc * fVar139 + auVar286._12_4_;
    fVar156 = (local_318 * fVar109 + local_3e8 * local_358 + local_3d8 * fVar126) -
              (float)local_418._0_4_ * (float)local_2d8._0_4_;
    fVar175 = (fStack_314 * fVar125 + fStack_3e4 * fStack_354 + fStack_3d4 * fVar68) -
              (float)local_418._4_4_ * (float)local_2d8._4_4_;
    fVar176 = (fStack_310 * fVar127 + fStack_3e0 * fStack_350 + fStack_3d0 * fVar107) -
              fStack_410 * fStack_2d0;
    fVar177 = (fStack_30c * fVar139 + fStack_3dc * fStack_34c + fStack_3cc * fVar108) -
              fStack_40c * fStack_2cc;
    local_548._0_4_ =
         (fVar109 * fVar109 + local_358 * local_358 + fVar126 * fVar126) -
         (float)local_2d8._0_4_ * (float)local_2d8._0_4_;
    local_548._4_4_ =
         (fVar125 * fVar125 + fStack_354 * fStack_354 + fVar68 * fVar68) -
         (float)local_2d8._4_4_ * (float)local_2d8._4_4_;
    fStack_540 = (fVar127 * fVar127 + fStack_350 * fStack_350 + fVar107 * fVar107) -
                 fStack_2d0 * fStack_2d0;
    fStack_53c = (fVar139 * fVar139 + fStack_34c * fStack_34c + fVar108 * fVar108) -
                 fStack_2cc * fStack_2cc;
    fVar140 = (auVar218._0_4_ + auVar78._0_4_) * 1.0000002;
    fVar142 = (auVar218._4_4_ + auVar78._4_4_) * 1.0000002;
    fVar154 = (auVar218._8_4_ + auVar78._8_4_) * 1.0000002;
    fVar155 = (auVar218._12_4_ + auVar78._12_4_) * 1.0000002;
    auVar183._0_4_ = (float)local_548._0_4_ - fVar140 * fVar140;
    auVar183._4_4_ = (float)local_548._4_4_ - fVar142 * fVar142;
    auVar183._8_4_ = fStack_540 - fVar154 * fVar154;
    auVar183._12_4_ = fStack_53c - fVar155 * fVar155;
    local_228 = (float)local_418._0_4_ * (float)local_418._0_4_;
    fStack_224 = (float)local_418._4_4_ * (float)local_418._4_4_;
    fStack_220 = fStack_410 * fStack_410;
    fStack_21c = fStack_40c * fStack_40c;
    local_328._0_4_ = local_128 - local_228;
    local_328._4_4_ = fStack_124 - fStack_224;
    fStack_320 = fStack_120 - fStack_220;
    fStack_31c = fStack_11c - fStack_21c;
    fVar156 = fVar156 + fVar156;
    fVar175 = fVar175 + fVar175;
    fVar176 = fVar176 + fVar176;
    fVar177 = fVar177 + fVar177;
    local_388 = fVar156 * fVar156;
    fStack_384 = fVar175 * fVar175;
    fStack_380 = fVar176 * fVar176;
    fStack_37c = fVar177 * fVar177;
    local_428._0_4_ = (float)local_328._0_4_ * 4.0;
    local_428._4_4_ = (float)local_328._4_4_ * 4.0;
    fStack_420 = fStack_320 * 4.0;
    fStack_41c = fStack_31c * 4.0;
    auVar219._0_4_ = local_388 - (float)local_428._0_4_ * auVar183._0_4_;
    auVar219._4_4_ = fStack_384 - (float)local_428._4_4_ * auVar183._4_4_;
    auVar219._8_4_ = fStack_380 - fStack_420 * auVar183._8_4_;
    auVar219._12_4_ = fStack_37c - fStack_41c * auVar183._12_4_;
    auVar264._0_4_ = (auVar244._0_4_ - auVar78._0_4_) * 0.99999976;
    auVar264._4_4_ = (auVar244._4_4_ - auVar78._4_4_) * 0.99999976;
    auVar264._8_4_ = (auVar244._8_4_ - auVar78._8_4_) * 0.99999976;
    auVar264._12_4_ = (auVar244._12_4_ - auVar78._12_4_) * 0.99999976;
    auVar161._4_4_ = -(uint)(0.0 <= auVar219._4_4_);
    auVar161._0_4_ = -(uint)(0.0 <= auVar219._0_4_);
    auVar161._8_4_ = -(uint)(0.0 <= auVar219._8_4_);
    auVar161._12_4_ = -(uint)(0.0 <= auVar219._12_4_);
    uVar53 = 0;
    iVar47 = movmskps((int)uVar56,auVar161);
    if (iVar47 == 0) {
      iVar47 = 0;
      auVar115 = _DAT_01feb9f0;
      auVar185 = _DAT_01feba00;
    }
    else {
      auVar244 = sqrtps(auVar286,auVar219);
      bVar9 = 0.0 <= auVar219._0_4_;
      uVar59 = -(uint)bVar9;
      bVar58 = 0.0 <= auVar219._4_4_;
      uVar61 = -(uint)bVar58;
      bVar10 = 0.0 <= auVar219._8_4_;
      uVar63 = -(uint)bVar10;
      bVar11 = 0.0 <= auVar219._12_4_;
      uVar65 = -(uint)bVar11;
      auVar114._0_4_ = (float)local_328._0_4_ + (float)local_328._0_4_;
      auVar114._4_4_ = (float)local_328._4_4_ + (float)local_328._4_4_;
      auVar114._8_4_ = fStack_320 + fStack_320;
      auVar114._12_4_ = fStack_31c + fStack_31c;
      auVar78 = rcpps(auVar183,auVar114);
      fVar140 = auVar78._0_4_;
      fVar154 = auVar78._4_4_;
      fVar128 = auVar78._8_4_;
      fVar188 = auVar78._12_4_;
      fVar140 = (1.0 - auVar114._0_4_ * fVar140) * fVar140 + fVar140;
      fVar154 = (1.0 - auVar114._4_4_ * fVar154) * fVar154 + fVar154;
      fVar128 = (1.0 - auVar114._8_4_ * fVar128) * fVar128 + fVar128;
      fVar188 = (1.0 - auVar114._12_4_ * fVar188) * fVar188 + fVar188;
      fVar142 = (-fVar156 - auVar244._0_4_) * fVar140;
      fVar155 = (-fVar175 - auVar244._4_4_) * fVar154;
      fVar187 = (-fVar176 - auVar244._8_4_) * fVar128;
      fVar141 = (-fVar177 - auVar244._12_4_) * fVar188;
      fVar140 = (auVar244._0_4_ - fVar156) * fVar140;
      fVar154 = (auVar244._4_4_ - fVar175) * fVar154;
      fVar128 = (auVar244._8_4_ - fVar176) * fVar128;
      fVar188 = (auVar244._12_4_ - fVar177) * fVar188;
      local_2a8._4_4_ = ((float)local_418._4_4_ * fVar155 + (float)local_2d8._4_4_) * fStack_2e4;
      local_2a8._0_4_ = ((float)local_418._0_4_ * fVar142 + (float)local_2d8._0_4_) * local_2e8;
      fStack_2a0 = (fStack_410 * fVar187 + fStack_2d0) * fStack_2e0;
      fStack_29c = (fStack_40c * fVar141 + fStack_2cc) * fStack_2dc;
      local_2b8[0] = ((float)local_418._0_4_ * fVar140 + (float)local_2d8._0_4_) * local_2e8;
      local_2b8[1] = ((float)local_418._4_4_ * fVar154 + (float)local_2d8._4_4_) * fStack_2e4;
      local_2b8[2] = (fStack_410 * fVar128 + fStack_2d0) * fStack_2e0;
      local_2b8[3] = (fStack_40c * fVar188 + fStack_2cc) * fStack_2dc;
      auVar184._0_4_ = (uint)fVar142 & uVar59;
      auVar184._4_4_ = (uint)fVar155 & uVar61;
      auVar184._8_4_ = (uint)fVar187 & uVar63;
      auVar184._12_4_ = (uint)fVar141 & uVar65;
      auVar115._0_8_ = CONCAT44(~uVar61,~uVar59) & 0x7f8000007f800000;
      auVar115._8_4_ = ~uVar63 & 0x7f800000;
      auVar115._12_4_ = ~uVar65 & 0x7f800000;
      auVar115 = auVar115 | auVar184;
      auVar287._0_4_ = (uint)fVar140 & uVar59;
      auVar287._4_4_ = (uint)fVar154 & uVar61;
      auVar287._8_4_ = (uint)fVar128 & uVar63;
      auVar287._12_4_ = (uint)fVar188 & uVar65;
      auVar185._0_8_ = CONCAT44(~uVar61,~uVar59) & 0xff800000ff800000;
      auVar185._8_4_ = ~uVar63 & 0xff800000;
      auVar185._12_4_ = ~uVar65 & 0xff800000;
      auVar185 = auVar185 | auVar287;
      auVar232._0_8_ = CONCAT44(fStack_224,local_228) & 0x7fffffff7fffffff;
      auVar232._8_4_ = ABS(fStack_220);
      auVar232._12_4_ = ABS(fStack_21c);
      auVar29._4_4_ = fStack_284;
      auVar29._0_4_ = local_288;
      auVar29._8_4_ = fStack_280;
      auVar29._12_4_ = fStack_27c;
      auVar78 = maxps(auVar29,auVar232);
      fVar140 = auVar78._0_4_ * 1.9073486e-06;
      fVar142 = auVar78._4_4_ * 1.9073486e-06;
      fVar154 = auVar78._8_4_ * 1.9073486e-06;
      fVar155 = auVar78._12_4_ * 1.9073486e-06;
      auVar233._0_4_ = -(uint)(ABS((float)local_328._0_4_) < fVar140 && bVar9);
      auVar233._4_4_ = -(uint)(ABS((float)local_328._4_4_) < fVar142 && bVar58);
      auVar233._8_4_ = -(uint)(ABS(fStack_320) < fVar154 && bVar10);
      auVar233._12_4_ = -(uint)(ABS(fStack_31c) < fVar155 && bVar11);
      iVar47 = movmskps(iVar47,auVar233);
      if (iVar47 != 0) {
        uVar59 = -(uint)(auVar183._0_4_ <= 0.0);
        uVar61 = -(uint)(auVar183._4_4_ <= 0.0);
        uVar63 = -(uint)(auVar183._8_4_ <= 0.0);
        uVar65 = -(uint)(auVar183._12_4_ <= 0.0);
        auVar279._0_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar233._0_4_;
        auVar279._4_4_ = (uVar61 & 0xff800000 | ~uVar61 & 0x7f800000) & auVar233._4_4_;
        auVar279._8_4_ = (uVar63 & 0xff800000 | ~uVar63 & 0x7f800000) & auVar233._8_4_;
        auVar279._12_4_ = (uVar65 & 0xff800000 | ~uVar65 & 0x7f800000) & auVar233._12_4_;
        auVar172._0_4_ = ~auVar233._0_4_ & auVar115._0_4_;
        auVar172._4_4_ = ~auVar233._4_4_ & auVar115._4_4_;
        auVar172._8_4_ = ~auVar233._8_4_ & auVar115._8_4_;
        auVar172._12_4_ = ~auVar233._12_4_ & auVar115._12_4_;
        auVar115 = auVar172 | auVar279;
        auVar173._0_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar233._0_4_;
        auVar173._4_4_ = (uVar61 & 0x7f800000 | ~uVar61 & 0xff800000) & auVar233._4_4_;
        auVar173._8_4_ = (uVar63 & 0x7f800000 | ~uVar63 & 0xff800000) & auVar233._8_4_;
        auVar173._12_4_ = (uVar65 & 0x7f800000 | ~uVar65 & 0xff800000) & auVar233._12_4_;
        auVar239._0_4_ = ~auVar233._0_4_ & auVar185._0_4_;
        auVar239._4_4_ = ~auVar233._4_4_ & auVar185._4_4_;
        auVar239._8_4_ = ~auVar233._8_4_ & auVar185._8_4_;
        auVar239._12_4_ = ~auVar233._12_4_ & auVar185._12_4_;
        auVar185 = auVar239 | auVar173;
        auVar161._4_4_ =
             -(uint)((fVar142 <= ABS((float)local_328._4_4_) || auVar183._4_4_ <= 0.0) && bVar58);
        auVar161._0_4_ =
             -(uint)((fVar140 <= ABS((float)local_328._0_4_) || auVar183._0_4_ <= 0.0) && bVar9);
        auVar161._8_4_ = -(uint)((fVar154 <= ABS(fStack_320) || auVar183._8_4_ <= 0.0) && bVar10);
        auVar161._12_4_ = -(uint)((fVar155 <= ABS(fStack_31c) || auVar183._12_4_ <= 0.0) && bVar11);
      }
    }
    auVar162._0_4_ = (auVar161._0_4_ << 0x1f) >> 0x1f;
    auVar162._4_4_ = (auVar161._4_4_ << 0x1f) >> 0x1f;
    auVar162._8_4_ = (auVar161._8_4_ << 0x1f) >> 0x1f;
    auVar162._12_4_ = (auVar161._12_4_ << 0x1f) >> 0x1f;
    auVar162 = auVar162 & local_218;
    iVar47 = movmskps(iVar47,auVar162);
    uVar56 = uVar49;
    if (iVar47 != 0) {
      auVar220._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_2c8._0_4_;
      auVar220._4_4_ = auVar220._0_4_;
      auVar220._8_4_ = auVar220._0_4_;
      auVar220._12_4_ = auVar220._0_4_;
      auVar244 = maxps(auVar220,auVar115);
      auVar288._0_4_ = (ray->super_RayK<1>).tfar - (float)local_2c8._0_4_;
      auVar288._4_4_ = auVar288._0_4_;
      auVar288._8_4_ = auVar288._0_4_;
      auVar288._12_4_ = auVar288._0_4_;
      auVar218 = minps(auVar288,auVar185);
      auVar91._0_4_ = fVar126 * local_4b8;
      auVar91._4_4_ = fVar68 * local_538;
      auVar91._8_4_ = fVar107 * fStack_534;
      auVar91._12_4_ = fVar108 * fStack_530;
      auVar245._0_4_ = local_558 * local_318 + fVar253 * local_3e8 + local_4b8 * local_3d8;
      auVar245._4_4_ = local_518 * fStack_314 + local_528 * fStack_3e4 + local_538 * fStack_3d4;
      auVar245._8_4_ = fStack_514 * fStack_310 + fStack_524 * fStack_3e0 + fStack_534 * fStack_3d0;
      auVar245._12_4_ = fStack_510 * fStack_30c + fStack_520 * fStack_3dc + fStack_530 * fStack_3cc;
      auVar78 = rcpps(auVar91,auVar245);
      fVar126 = auVar78._0_4_;
      fVar68 = auVar78._4_4_;
      fVar107 = auVar78._8_4_;
      fVar108 = auVar78._12_4_;
      fVar126 = ((fVar242 - auVar245._0_4_ * fVar126) * fVar126 + fVar126) *
                -(fVar109 * local_558 + local_358 * fVar253 + auVar91._0_4_);
      fVar68 = ((fVar254 - auVar245._4_4_ * fVar68) * fVar68 + fVar68) *
               -(fVar125 * local_518 + fStack_354 * local_528 + auVar91._4_4_);
      fVar107 = ((fVar258 - auVar245._8_4_ * fVar107) * fVar107 + fVar107) *
                -(fVar127 * fStack_514 + fStack_350 * fStack_524 + auVar91._8_4_);
      fVar108 = ((fVar265 - auVar245._12_4_ * fVar108) * fVar108 + fVar108) *
                -(fVar139 * fStack_510 + fStack_34c * fStack_520 + auVar91._12_4_);
      auVar195._0_12_ = ZEXT812(0);
      auVar195._12_4_ = 0.0;
      uVar59 = -(uint)(auVar245._0_4_ < 0.0 || ABS(auVar245._0_4_) < 1e-18);
      uVar61 = -(uint)(auVar245._4_4_ < 0.0 || ABS(auVar245._4_4_) < 1e-18);
      uVar63 = -(uint)(auVar245._8_4_ < 0.0 || ABS(auVar245._8_4_) < 1e-18);
      uVar65 = -(uint)(auVar245._12_4_ < 0.0 || ABS(auVar245._12_4_) < 1e-18);
      auVar186._0_8_ = CONCAT44(uVar61,uVar59) & 0xff800000ff800000;
      auVar186._8_4_ = uVar63 & 0xff800000;
      auVar186._12_4_ = uVar65 & 0xff800000;
      auVar92._0_4_ = ~uVar59 & (uint)fVar126;
      auVar92._4_4_ = ~uVar61 & (uint)fVar68;
      auVar92._8_4_ = ~uVar63 & (uint)fVar107;
      auVar92._12_4_ = ~uVar65 & (uint)fVar108;
      auVar244 = maxps(auVar244,auVar92 | auVar186);
      uVar59 = -(uint)(0.0 < auVar245._0_4_ || ABS(auVar245._0_4_) < 1e-18);
      uVar61 = -(uint)(0.0 < auVar245._4_4_ || ABS(auVar245._4_4_) < 1e-18);
      uVar63 = -(uint)(0.0 < auVar245._8_4_ || ABS(auVar245._8_4_) < 1e-18);
      uVar65 = -(uint)(0.0 < auVar245._12_4_ || ABS(auVar245._12_4_) < 1e-18);
      auVar93._0_8_ = CONCAT44(uVar61,uVar59) & 0x7f8000007f800000;
      auVar93._8_4_ = uVar63 & 0x7f800000;
      auVar93._12_4_ = uVar65 & 0x7f800000;
      auVar246._0_4_ = ~uVar59 & (uint)fVar126;
      auVar246._4_4_ = ~uVar61 & (uint)fVar68;
      auVar246._8_4_ = ~uVar63 & (uint)fVar107;
      auVar246._12_4_ = ~uVar65 & (uint)fVar108;
      auVar218 = minps(auVar218,auVar246 | auVar93);
      auVar116._0_4_ = (0.0 - fVar289) * -local_528 + (0.0 - fVar271) * -local_538;
      auVar116._4_4_ = (0.0 - fVar290) * -fStack_524 + (0.0 - fVar273) * -fStack_534;
      auVar116._8_4_ = (0.0 - fVar291) * -fStack_520 + (0.0 - fVar275) * -fStack_530;
      auVar116._12_4_ = 0x80000000;
      auVar247._0_4_ = -local_518 * local_318 + -local_528 * local_3e8 + -local_538 * local_3d8;
      auVar247._4_4_ =
           -fStack_514 * fStack_314 + -fStack_524 * fStack_3e4 + -fStack_534 * fStack_3d4;
      auVar247._8_4_ =
           -fStack_510 * fStack_310 + -fStack_520 * fStack_3e0 + -fStack_530 * fStack_3d0;
      auVar247._12_4_ = fStack_30c * -0.0 + fStack_3dc * -0.0 + fStack_3cc * -0.0;
      auVar78 = rcpps(auVar116,auVar247);
      fVar126 = auVar78._0_4_;
      fVar68 = auVar78._4_4_;
      fVar107 = auVar78._8_4_;
      fVar108 = auVar78._12_4_;
      fVar126 = ((fVar242 - auVar247._0_4_ * fVar126) * fVar126 + fVar126) *
                -((0.0 - fVar281) * -local_518 + auVar116._0_4_);
      fVar68 = ((fVar254 - auVar247._4_4_ * fVar68) * fVar68 + fVar68) *
               -((0.0 - fVar283) * -fStack_514 + auVar116._4_4_);
      fVar107 = ((fVar258 - auVar247._8_4_ * fVar107) * fVar107 + fVar107) *
                -((0.0 - fVar284) * -fStack_510 + auVar116._8_4_);
      fVar108 = ((fVar265 - auVar247._12_4_ * fVar108) * fVar108 + fVar108) * 0.0;
      uVar59 = -(uint)(auVar247._0_4_ < 0.0 || ABS(auVar247._0_4_) < 1e-18);
      uVar61 = -(uint)(auVar247._4_4_ < 0.0 || ABS(auVar247._4_4_) < 1e-18);
      uVar63 = -(uint)(auVar247._8_4_ < 0.0 || ABS(auVar247._8_4_) < 1e-18);
      uVar65 = -(uint)(auVar247._12_4_ < 0.0 || ABS(auVar247._12_4_) < 1e-18);
      auVar117._0_8_ = CONCAT44(uVar61,uVar59) & 0xff800000ff800000;
      auVar117._8_4_ = uVar63 & 0xff800000;
      auVar117._12_4_ = uVar65 & 0xff800000;
      auVar94._0_4_ = ~uVar59 & (uint)fVar126;
      auVar94._4_4_ = ~uVar61 & (uint)fVar68;
      auVar94._8_4_ = ~uVar63 & (uint)fVar107;
      auVar94._12_4_ = ~uVar65 & (uint)fVar108;
      local_3b8 = maxps(auVar244,auVar94 | auVar117);
      uVar59 = -(uint)(0.0 < auVar247._0_4_ || ABS(auVar247._0_4_) < 1e-18);
      uVar61 = -(uint)(0.0 < auVar247._4_4_ || ABS(auVar247._4_4_) < 1e-18);
      uVar63 = -(uint)(0.0 < auVar247._8_4_ || ABS(auVar247._8_4_) < 1e-18);
      uVar65 = -(uint)(0.0 < auVar247._12_4_ || ABS(auVar247._12_4_) < 1e-18);
      auVar95._0_8_ = CONCAT44(uVar61,uVar59) & 0x7f8000007f800000;
      auVar95._8_4_ = uVar63 & 0x7f800000;
      auVar95._12_4_ = uVar65 & 0x7f800000;
      auVar248._0_4_ = ~uVar59 & (uint)fVar126;
      auVar248._4_4_ = ~uVar61 & (uint)fVar68;
      auVar248._8_4_ = ~uVar63 & (uint)fVar107;
      auVar248._12_4_ = ~uVar65 & (uint)fVar108;
      local_248 = minps(auVar218,auVar248 | auVar95);
      fVar126 = local_3b8._0_4_;
      fVar68 = local_3b8._4_4_;
      fVar107 = local_3b8._8_4_;
      fVar108 = local_3b8._12_4_;
      uVar59 = -(uint)(fVar126 <= local_248._0_4_) & auVar162._0_4_;
      uVar61 = -(uint)(fVar68 <= local_248._4_4_) & auVar162._4_4_;
      uVar63 = -(uint)(fVar107 <= local_248._8_4_) & auVar162._8_4_;
      uVar65 = -(uint)(fVar108 <= local_248._12_4_) & auVar162._12_4_;
      auVar12._4_4_ = uVar61;
      auVar12._0_4_ = uVar59;
      auVar12._8_4_ = uVar63;
      auVar12._12_4_ = uVar65;
      iVar47 = movmskps(iVar47,auVar12);
      if (iVar47 != 0) {
        auVar78 = maxps(ZEXT816(0),auVar264);
        auVar244 = minps(_local_2a8,_DAT_01feca10);
        auVar244 = maxps(auVar244,auVar195);
        auVar28._4_4_ = local_2b8[1];
        auVar28._0_4_ = local_2b8[0];
        auVar28._8_4_ = local_2b8[2];
        auVar28._12_4_ = local_2b8[3];
        auVar218 = minps(auVar28,_DAT_01feca10);
        auVar218 = maxps(auVar218,auVar195);
        local_2a8._0_4_ = (auVar244._0_4_ + 0.0) * (float)DAT_01ff1da0 * local_368 + local_3f8;
        local_2a8._4_4_ = (auVar244._4_4_ + 1.0) * DAT_01ff1da0._4_4_ * local_368 + local_3f8;
        fStack_2a0 = (auVar244._8_4_ + 2.0) * DAT_01ff1da0._8_4_ * local_368 + local_3f8;
        fStack_29c = (auVar244._12_4_ + 3.0) * DAT_01ff1da0._12_4_ * local_368 + local_3f8;
        local_2b8[0] = (auVar218._0_4_ + 0.0) * (float)DAT_01ff1da0 * local_368 + local_3f8;
        local_2b8[1] = (auVar218._4_4_ + 1.0) * DAT_01ff1da0._4_4_ * local_368 + local_3f8;
        local_2b8[2] = (auVar218._8_4_ + 2.0) * DAT_01ff1da0._8_4_ * local_368 + local_3f8;
        local_2b8[3] = (auVar218._12_4_ + 3.0) * DAT_01ff1da0._12_4_ * local_368 + local_3f8;
        fVar109 = (float)local_548._0_4_ - auVar78._0_4_ * auVar78._0_4_;
        fVar125 = (float)local_548._4_4_ - auVar78._4_4_ * auVar78._4_4_;
        fVar127 = fStack_540 - auVar78._8_4_ * auVar78._8_4_;
        fVar139 = fStack_53c - auVar78._12_4_ * auVar78._12_4_;
        auVar221._0_4_ = local_388 - (float)local_428._0_4_ * fVar109;
        auVar221._4_4_ = fStack_384 - (float)local_428._4_4_ * fVar125;
        auVar221._8_4_ = fStack_380 - fStack_420 * fVar127;
        auVar221._12_4_ = fStack_37c - fStack_41c * fVar139;
        local_428._4_4_ = -(uint)(0.0 <= auVar221._4_4_);
        local_428._0_4_ = -(uint)(0.0 <= auVar221._0_4_);
        fStack_420 = (float)-(uint)(0.0 <= auVar221._8_4_);
        fStack_41c = (float)-(uint)(0.0 <= auVar221._12_4_);
        iVar47 = movmskps(iVar47,_local_428);
        if (iVar47 == 0) {
          fVar189 = 0.0;
          fVar196 = 0.0;
          fVar197 = 0.0;
          fVar198 = 0.0;
          fVar128 = 0.0;
          fVar187 = 0.0;
          fVar188 = 0.0;
          fVar141 = 0.0;
          fVar140 = 0.0;
          fVar142 = 0.0;
          fVar154 = 0.0;
          fVar155 = 0.0;
          fVar156 = 0.0;
          fVar175 = 0.0;
          fVar176 = 0.0;
          fVar177 = 0.0;
          _local_498 = ZEXT816(0);
          iVar47 = 0;
          auVar118 = _DAT_01feba00;
          auVar234 = _DAT_01feb9f0;
          fStack_554 = local_518;
          fStack_550 = fStack_514;
          fStack_54c = fStack_510;
        }
        else {
          local_578._4_4_ = uVar61;
          local_578._0_4_ = uVar59;
          fStack_570 = (float)uVar63;
          fStack_56c = (float)uVar65;
          local_548._4_4_ = fVar125;
          local_548._0_4_ = fVar109;
          fStack_540 = fVar127;
          fStack_53c = fVar139;
          auVar244 = sqrtps(_DAT_01ff1da0,auVar221);
          auVar96._0_4_ = (float)local_328._0_4_ + (float)local_328._0_4_;
          auVar96._4_4_ = (float)local_328._4_4_ + (float)local_328._4_4_;
          auVar96._8_4_ = fStack_320 + fStack_320;
          auVar96._12_4_ = fStack_31c + fStack_31c;
          auVar78 = rcpps(_local_2a8,auVar96);
          fVar224 = auVar78._0_4_;
          fVar225 = auVar78._4_4_;
          fVar226 = auVar78._8_4_;
          fVar240 = auVar78._12_4_;
          fVar224 = (fVar242 - auVar96._0_4_ * fVar224) * fVar224 + fVar224;
          fVar225 = (fVar254 - auVar96._4_4_ * fVar225) * fVar225 + fVar225;
          fVar226 = (fVar258 - auVar96._8_4_ * fVar226) * fVar226 + fVar226;
          fVar240 = (fVar265 - auVar96._12_4_ * fVar240) * fVar240 + fVar240;
          fVar241 = (-fVar156 - auVar244._0_4_) * fVar224;
          fVar242 = (-fVar175 - auVar244._4_4_) * fVar225;
          fVar253 = (-fVar176 - auVar244._8_4_) * fVar226;
          fVar254 = (-fVar177 - auVar244._12_4_) * fVar240;
          fVar224 = (auVar244._0_4_ - fVar156) * fVar224;
          fVar225 = (auVar244._4_4_ - fVar175) * fVar225;
          fVar226 = (auVar244._8_4_ - fVar176) * fVar226;
          fVar240 = (auVar244._12_4_ - fVar177) * fVar240;
          fVar128 = ((float)local_418._0_4_ * fVar241 + (float)local_2d8._0_4_) * local_2e8;
          fVar187 = ((float)local_418._4_4_ * fVar242 + (float)local_2d8._4_4_) * fStack_2e4;
          fVar188 = (fStack_410 * fVar253 + fStack_2d0) * fStack_2e0;
          fVar141 = (fStack_40c * fVar254 + fStack_2cc) * fStack_2dc;
          fVar140 = local_318 * fVar241 - ((float)local_408._0_4_ * fVar128 + fVar277);
          fVar142 = fStack_314 * fVar242 - ((float)local_408._4_4_ * fVar187 + fVar281);
          fVar154 = fStack_310 * fVar253 - (fStack_400 * fVar188 + fVar283);
          fVar155 = fStack_30c * fVar254 - (fStack_3fc * fVar141 + fVar284);
          fVar156 = local_3e8 * fVar241 - (local_398 * fVar128 + fVar285);
          fVar175 = fStack_3e4 * fVar242 - (fStack_394 * fVar187 + fVar289);
          fVar176 = fStack_3e0 * fVar253 - (fStack_390 * fVar188 + fVar290);
          fVar177 = fStack_3dc * fVar254 - (fStack_38c * fVar141 + fVar291);
          local_498._4_4_ = fStack_3d4 * fVar242 - (fVar187 * fStack_3c4 + fVar271);
          local_498._0_4_ = local_3d8 * fVar241 - (fVar128 * local_3c8 + fVar269);
          fStack_490 = fStack_3d0 * fVar253 - (fVar188 * fStack_3c0 + fVar273);
          fStack_48c = fStack_3cc * fVar254 - (fVar141 * fStack_3bc + fVar275);
          local_2e8 = ((float)local_418._0_4_ * fVar224 + (float)local_2d8._0_4_) * local_2e8;
          fStack_2e4 = ((float)local_418._4_4_ * fVar225 + (float)local_2d8._4_4_) * fStack_2e4;
          fStack_2e0 = (fStack_410 * fVar226 + fStack_2d0) * fStack_2e0;
          fStack_2dc = (fStack_40c * fVar240 + fStack_2cc) * fStack_2dc;
          fVar189 = local_318 * fVar224 - ((float)local_408._0_4_ * local_2e8 + fVar277);
          fVar196 = fStack_314 * fVar225 - ((float)local_408._4_4_ * fStack_2e4 + fVar281);
          fVar197 = fStack_310 * fVar226 - (fStack_400 * fStack_2e0 + fVar283);
          fVar198 = fStack_30c * fVar240 - (fStack_3fc * fStack_2dc + fVar284);
          fVar128 = local_3e8 * fVar224 - (local_398 * local_2e8 + fVar285);
          fVar187 = fStack_3e4 * fVar225 - (fStack_394 * fStack_2e4 + fVar289);
          fVar188 = fStack_3e0 * fVar226 - (fStack_390 * fStack_2e0 + fVar290);
          fVar141 = fStack_3dc * fVar240 - (fStack_38c * fStack_2dc + fVar291);
          bVar9 = 0.0 <= auVar221._0_4_;
          uVar60 = -(uint)bVar9;
          bVar58 = 0.0 <= auVar221._4_4_;
          uVar62 = -(uint)bVar58;
          bVar10 = 0.0 <= auVar221._8_4_;
          uVar64 = -(uint)bVar10;
          bVar11 = 0.0 <= auVar221._12_4_;
          uVar66 = -(uint)bVar11;
          auVar195._0_4_ = local_3d8 * fVar224 - (local_2e8 * local_3c8 + fVar269);
          auVar195._4_4_ = fStack_3d4 * fVar225 - (fStack_2e4 * fStack_3c4 + fVar271);
          auVar195._8_4_ = fStack_3d0 * fVar226 - (fStack_2e0 * fStack_3c0 + fVar273);
          auVar195._12_4_ = fStack_3cc * fVar240 - (fStack_2dc * fStack_3bc + fVar275);
          auVar249._0_4_ = (uint)fVar241 & uVar60;
          auVar249._4_4_ = (uint)fVar242 & uVar62;
          auVar249._8_4_ = (uint)fVar253 & uVar64;
          auVar249._12_4_ = (uint)fVar254 & uVar66;
          auVar234._0_8_ = CONCAT44(~uVar62,~uVar60) & 0x7f8000007f800000;
          auVar234._8_4_ = ~uVar64 & 0x7f800000;
          auVar234._12_4_ = ~uVar66 & 0x7f800000;
          auVar234 = auVar234 | auVar249;
          auVar163._0_4_ = (uint)fVar224 & uVar60;
          auVar163._4_4_ = (uint)fVar225 & uVar62;
          auVar163._8_4_ = (uint)fVar226 & uVar64;
          auVar163._12_4_ = (uint)fVar240 & uVar66;
          auVar118._0_8_ = CONCAT44(~uVar62,~uVar60) & 0xff800000ff800000;
          auVar118._8_4_ = ~uVar64 & 0xff800000;
          auVar118._12_4_ = ~uVar66 & 0xff800000;
          auVar118 = auVar118 | auVar163;
          auVar97._0_8_ = CONCAT44(fStack_224,local_228) & 0x7fffffff7fffffff;
          auVar97._8_4_ = ABS(fStack_220);
          auVar97._12_4_ = ABS(fStack_21c);
          auVar30._4_4_ = fStack_284;
          auVar30._0_4_ = local_288;
          auVar30._8_4_ = fStack_280;
          auVar30._12_4_ = fStack_27c;
          auVar78 = maxps(auVar30,auVar97);
          fVar224 = auVar78._0_4_ * 1.9073486e-06;
          fVar225 = auVar78._4_4_ * 1.9073486e-06;
          fVar226 = auVar78._8_4_ * 1.9073486e-06;
          fVar240 = auVar78._12_4_ * 1.9073486e-06;
          auVar164._0_4_ = -(uint)(ABS((float)local_328._0_4_) < fVar224 && bVar9);
          auVar164._4_4_ = -(uint)(ABS((float)local_328._4_4_) < fVar225 && bVar58);
          auVar164._8_4_ = -(uint)(ABS(fStack_320) < fVar226 && bVar10);
          auVar164._12_4_ = -(uint)(ABS(fStack_31c) < fVar240 && bVar11);
          iVar47 = movmskps(iVar47,auVar164);
          local_558 = fVar140;
          fStack_554 = fVar142;
          fStack_550 = fVar154;
          fStack_54c = fVar155;
          if (iVar47 != 0) {
            uVar60 = -(uint)(fVar109 <= 0.0);
            uVar62 = -(uint)(fVar125 <= 0.0);
            uVar64 = -(uint)(fVar127 <= 0.0);
            uVar66 = -(uint)(fVar139 <= 0.0);
            auVar256._0_4_ = (uVar60 & 0xff800000 | ~uVar60 & 0x7f800000) & auVar164._0_4_;
            auVar256._4_4_ = (uVar62 & 0xff800000 | ~uVar62 & 0x7f800000) & auVar164._4_4_;
            auVar256._8_4_ = (uVar64 & 0xff800000 | ~uVar64 & 0x7f800000) & auVar164._8_4_;
            auVar256._12_4_ = (uVar66 & 0xff800000 | ~uVar66 & 0x7f800000) & auVar164._12_4_;
            auVar252._0_4_ = ~auVar164._0_4_ & auVar234._0_4_;
            auVar252._4_4_ = ~auVar164._4_4_ & auVar234._4_4_;
            auVar252._8_4_ = ~auVar164._8_4_ & auVar234._8_4_;
            auVar252._12_4_ = ~auVar164._12_4_ & auVar234._12_4_;
            auVar234 = auVar252 | auVar256;
            auVar257._0_4_ = (uVar60 & 0x7f800000 | ~uVar60 & 0xff800000) & auVar164._0_4_;
            auVar257._4_4_ = (uVar62 & 0x7f800000 | ~uVar62 & 0xff800000) & auVar164._4_4_;
            auVar257._8_4_ = (uVar64 & 0x7f800000 | ~uVar64 & 0xff800000) & auVar164._8_4_;
            auVar257._12_4_ = (uVar66 & 0x7f800000 | ~uVar66 & 0xff800000) & auVar164._12_4_;
            auVar174._0_4_ = ~auVar164._0_4_ & auVar118._0_4_;
            auVar174._4_4_ = ~auVar164._4_4_ & auVar118._4_4_;
            auVar174._8_4_ = ~auVar164._8_4_ & auVar118._8_4_;
            auVar174._12_4_ = ~auVar164._12_4_ & auVar118._12_4_;
            auVar118 = auVar174 | auVar257;
            local_428._4_4_ =
                 -(uint)((fVar225 <= ABS((float)local_328._4_4_) || fVar125 <= 0.0) && bVar58);
            local_428._0_4_ =
                 -(uint)((fVar224 <= ABS((float)local_328._0_4_) || fVar109 <= 0.0) && bVar9);
            fStack_420 = (float)-(uint)((fVar226 <= ABS(fStack_320) || fVar127 <= 0.0) && bVar10);
            fStack_41c = (float)-(uint)((fVar240 <= ABS(fStack_31c) || fVar139 <= 0.0) && bVar11);
          }
        }
        fVar109 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar125 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar127 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_408._4_4_ =
             -(uint)(0.3 <= ABS(fVar196 * fVar109 + fVar187 * fVar125 + auVar195._4_4_ * fVar127));
        local_408._0_4_ =
             -(uint)(0.3 <= ABS(fVar189 * fVar109 + fVar128 * fVar125 + auVar195._0_4_ * fVar127));
        fStack_400 = (float)-(uint)(0.3 <= ABS(fVar197 * fVar109 +
                                               fVar188 * fVar125 + auVar195._8_4_ * fVar127));
        fStack_3fc = (float)-(uint)(0.3 <= ABS(fVar198 * fVar109 +
                                               fVar141 * fVar125 + auVar195._12_4_ * fVar127));
        _local_118 = local_3b8;
        local_108 = minps(local_248,auVar234);
        _local_258 = maxps(local_3b8,auVar118);
        local_328._0_4_ = -(uint)(fVar126 <= local_108._0_4_) & uVar59;
        local_328._4_4_ = -(uint)(fVar68 <= local_108._4_4_) & uVar61;
        fStack_320 = (float)(-(uint)(fVar107 <= local_108._8_4_) & uVar63);
        fStack_31c = (float)(-(uint)(fVar108 <= local_108._12_4_) & uVar65);
        local_2f8 = _local_328;
        _local_418 = _local_258;
        local_308._0_4_ = -(uint)(local_258._0_4_ <= local_248._0_4_) & uVar59;
        local_308._4_4_ = -(uint)(local_258._4_4_ <= local_248._4_4_) & uVar61;
        local_308._8_4_ = -(uint)(local_258._8_4_ <= local_248._8_4_) & uVar63;
        local_308._12_4_ = -(uint)(local_258._12_4_ <= local_248._12_4_) & uVar65;
        _local_2d8 = local_308;
        iVar47 = movmskps(iVar47,local_308 | _local_328);
        if (iVar47 != 0) {
          local_2e8 = (float)(int)local_4a0;
          fStack_2e4 = (float)(int)local_4a0;
          fStack_2e0 = (float)(int)local_4a0;
          fStack_2dc = (float)(int)local_4a0;
          local_498._0_4_ =
               -(uint)((int)local_4a0 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_498._0_4_ * fVar127 +
                                                 fVar156 * fVar125 + fVar140 * fVar109)) &
                             local_428._0_4_) << 0x1f) >> 0x1f) + 4);
          local_498._4_4_ =
               -(uint)((int)local_4a0 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_498._4_4_ * fVar127 +
                                                 fVar175 * fVar125 + fVar142 * fVar109)) &
                             local_428._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_490 = (float)-(uint)((int)local_4a0 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_490 * fVar127 +
                                                                fVar176 * fVar125 +
                                                                fVar154 * fVar109)) &
                                            (uint)fStack_420) << 0x1f) >> 0x1f) + 4);
          fStack_48c = (float)-(uint)((int)local_4a0 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_48c * fVar127 +
                                                                fVar177 * fVar125 +
                                                                fVar155 * fVar109)) &
                                            (uint)fStack_41c) << 0x1f) >> 0x1f) + 4);
          local_2f8 = ~_local_498 & _local_328;
          iVar47 = movmskps(iVar47,local_2f8);
          fStack_4b4 = local_538;
          fStack_4b0 = fStack_534;
          fStack_4ac = fStack_530;
          if (iVar47 != 0) {
            local_3c8 = local_3a8 + fVar126;
            fStack_3c4 = fStack_3a4 + fVar68;
            fStack_3c0 = fStack_3a0 + fVar107;
            fStack_3bc = fStack_39c + fVar108;
            do {
              auVar244 = ~local_2f8 & _DAT_01feb9f0 | local_2f8 & local_3b8;
              auVar147._4_4_ = auVar244._0_4_;
              auVar147._0_4_ = auVar244._4_4_;
              auVar147._8_4_ = auVar244._12_4_;
              auVar147._12_4_ = auVar244._8_4_;
              auVar78 = minps(auVar147,auVar244);
              auVar119._0_8_ = auVar78._8_8_;
              auVar119._8_4_ = auVar78._0_4_;
              auVar119._12_4_ = auVar78._4_4_;
              auVar78 = minps(auVar119,auVar78);
              auVar120._0_8_ =
                   CONCAT44(-(uint)(auVar78._4_4_ == auVar244._4_4_) & local_2f8._4_4_,
                            -(uint)(auVar78._0_4_ == auVar244._0_4_) & local_2f8._0_4_);
              auVar120._8_4_ = -(uint)(auVar78._8_4_ == auVar244._8_4_) & local_2f8._8_4_;
              auVar120._12_4_ = -(uint)(auVar78._12_4_ == auVar244._12_4_) & local_2f8._12_4_;
              iVar47 = movmskps(iVar47,auVar120);
              auVar98 = local_2f8;
              if (iVar47 != 0) {
                auVar98._8_4_ = auVar120._8_4_;
                auVar98._0_8_ = auVar120._0_8_;
                auVar98._12_4_ = auVar120._12_4_;
              }
              uVar48 = movmskps(iVar47,auVar98);
              pRVar51 = (RayHit *)0x0;
              if (CONCAT44(uVar53,uVar48) != 0) {
                for (; (CONCAT44(uVar53,uVar48) >> (long)pRVar51 & 1) == 0;
                    pRVar51 = (RayHit *)((long)(pRVar51->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_2f8 + (long)pRVar51 * 4) = 0;
              fVar126 = *(float *)(local_2a8 + (long)pRVar51 * 4);
              auVar222 = ZEXT416(*(uint *)(local_118 + (long)pRVar51 * 4));
              local_568 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fStack_564 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fStack_560 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fStack_55c = (ray->super_RayK<1>).dir.field_0.m128[3];
              fVar68 = fStack_560 * fStack_560 + fStack_564 * fStack_564 + local_568 * local_568;
              if (fVar68 < 0.0) {
                fVar68 = sqrtf(fVar68);
                pRVar51 = extraout_RAX;
              }
              else {
                fVar68 = SQRT(fVar68);
              }
              auVar20._4_4_ = fStack_4f4;
              auVar20._0_4_ = local_4f8;
              auVar20._8_4_ = fStack_4f0;
              auVar20._12_4_ = fStack_4ec;
              auVar26._4_4_ = fStack_464;
              auVar26._0_4_ = local_468;
              auVar26._8_4_ = fStack_460;
              auVar26._12_4_ = fStack_45c;
              auVar244 = minps(auVar20,auVar26);
              auVar218 = maxps(auVar20,auVar26);
              auVar24._4_4_ = fStack_474;
              auVar24._0_4_ = local_478;
              auVar24._8_4_ = fStack_470;
              auVar24._12_4_ = fStack_46c;
              auVar22._4_4_ = fStack_484;
              auVar22._0_4_ = local_488;
              auVar22._8_4_ = fStack_480;
              auVar22._12_4_ = fStack_47c;
              auVar78 = minps(auVar24,auVar22);
              auVar244 = minps(auVar244,auVar78);
              auVar78 = maxps(auVar24,auVar22);
              auVar78 = maxps(auVar218,auVar78);
              auVar165._0_8_ = auVar244._0_8_ & 0x7fffffff7fffffff;
              auVar165._8_4_ = auVar244._8_4_ & 0x7fffffff;
              auVar165._12_4_ = auVar244._12_4_ & 0x7fffffff;
              local_398 = auVar78._12_4_;
              auVar99._0_8_ = auVar78._0_8_ & 0x7fffffff7fffffff;
              auVar99._8_4_ = auVar78._8_4_ & 0x7fffffff;
              auVar99._12_4_ = ABS(local_398);
              auVar78 = maxps(auVar165,auVar99);
              fVar107 = auVar78._4_4_;
              if (auVar78._4_4_ <= auVar78._0_4_) {
                fVar107 = auVar78._0_4_;
              }
              auVar166._8_8_ = auVar78._8_8_;
              auVar166._0_8_ = auVar78._8_8_;
              if (auVar78._8_4_ <= fVar107) {
                auVar166._0_4_ = fVar107;
              }
              register0x00001304 = auVar166._4_12_;
              local_578._0_4_ = auVar166._0_4_ * 1.9073486e-06;
              local_368 = fVar68 * 1.9073486e-06;
              fStack_394 = local_398;
              fStack_390 = local_398;
              fStack_38c = local_398;
              lVar57 = 4;
              do {
                fVar68 = 1.0 - fVar126;
                fVar127 = local_468 * fVar68 + local_478 * fVar126;
                fVar140 = fStack_464 * fVar68 + fStack_474 * fVar126;
                fVar142 = fStack_460 * fVar68 + fStack_470 * fVar126;
                fVar154 = fStack_45c * fVar68 + fStack_46c * fVar126;
                fVar107 = (local_4f8 * fVar68 + local_468 * fVar126) * fVar68 + fVar126 * fVar127;
                fVar108 = (fStack_4f4 * fVar68 + fStack_464 * fVar126) * fVar68 + fVar126 * fVar140;
                fVar109 = (fStack_4f0 * fVar68 + fStack_460 * fVar126) * fVar68 + fVar126 * fVar142;
                fVar125 = (fStack_4ec * fVar68 + fStack_45c * fVar126) * fVar68 + fVar126 * fVar154;
                fVar139 = fVar127 * fVar68 + (local_478 * fVar68 + local_488 * fVar126) * fVar126;
                fVar140 = fVar140 * fVar68 + (fStack_474 * fVar68 + fStack_484 * fVar126) * fVar126;
                fVar142 = fVar142 * fVar68 + (fStack_470 * fVar68 + fStack_480 * fVar126) * fVar126;
                fVar154 = fVar154 * fVar68 + (fStack_46c * fVar68 + fStack_47c * fVar126) * fVar126;
                fVar127 = auVar222._0_4_;
                local_348._0_4_ = fVar68 * fVar107 + fVar126 * fVar139;
                local_348._4_4_ = fVar68 * fVar108 + fVar126 * fVar140;
                fStack_340 = fVar68 * fVar109 + fVar126 * fVar142;
                fStack_33c = fVar68 * fVar125 + fVar126 * fVar154;
                fVar139 = (fVar139 - fVar107) * 3.0;
                fVar140 = (fVar140 - fVar108) * 3.0;
                fVar142 = (fVar142 - fVar109) * 3.0;
                fVar125 = (fVar154 - fVar125) * 3.0;
                local_558 = (fVar127 * local_568 + 0.0) - (float)local_348._0_4_;
                fStack_554 = (fVar127 * fStack_564 + 0.0) - (float)local_348._4_4_;
                fStack_550 = (fVar127 * fStack_560 + 0.0) - fStack_340;
                fStack_54c = (fVar127 * fStack_55c + 0.0) - fStack_33c;
                fVar107 = fStack_554 * fStack_554;
                fVar108 = fStack_550 * fStack_550;
                fVar109 = fStack_54c * fStack_54c;
                auVar250._0_4_ = fVar107 + local_558 * local_558 + fVar108;
                auVar250._4_4_ = fVar107 + fVar107 + fVar109;
                auVar250._8_4_ = fVar107 + fVar108 + fVar108;
                auVar250._12_4_ = fVar107 + fVar109 + fVar109;
                local_358 = auVar250._0_4_;
                if (auVar250._0_4_ < 0.0) {
                  local_598 = ZEXT416((uint)fVar68);
                  fVar107 = sqrtf(auVar250._0_4_);
                  pRVar52 = extraout_RAX_00;
                  fVar68 = (float)local_598._0_4_;
                }
                else {
                  fVar107 = SQRT(auVar250._0_4_);
                  pRVar52 = pRVar51;
                }
                fVar154 = fVar68 * 6.0;
                fVar108 = (fVar126 - (fVar68 + fVar68)) * 6.0;
                fVar109 = (fVar68 - (fVar126 + fVar126)) * 6.0;
                fVar68 = fVar126 * 6.0;
                fVar155 = fVar154 * local_4f8 +
                          fVar108 * local_468 + fVar109 * local_478 + fVar68 * local_488;
                fVar156 = fVar154 * fStack_4f4 +
                          fVar108 * fStack_464 + fVar109 * fStack_474 + fVar68 * fStack_484;
                fVar175 = fVar154 * fStack_4f0 +
                          fVar108 * fStack_460 + fVar109 * fStack_470 + fVar68 * fStack_480;
                local_4b8 = (float)local_578._0_4_;
                if ((float)local_578._0_4_ <= local_368 * fVar127) {
                  local_4b8 = local_368 * fVar127;
                }
                fVar176 = fVar140 * fVar140 + fVar139 * fVar139 + fVar142 * fVar142;
                auVar244 = ZEXT416((uint)fVar176);
                auVar78 = rsqrtss(ZEXT416((uint)fVar176),auVar244);
                fVar177 = auVar78._0_4_;
                fVar177 = fVar177 * fVar177 * fVar176 * -0.5 * fVar177 + fVar177 * 1.5;
                fVar128 = fVar142 * fVar175 + fVar140 * fVar156 + fVar139 * fVar155;
                auVar78 = rcpss(auVar244,auVar244);
                fVar187 = (2.0 - fVar176 * auVar78._0_4_) * auVar78._0_4_;
                local_538 = fVar187 * (fVar176 * fVar155 - fVar128 * fVar139) * fVar177;
                fStack_534 = fVar187 * (fVar176 * fVar156 - fVar128 * fVar140) * fVar177;
                fStack_530 = fVar187 * (fVar176 * fVar175 - fVar128 * fVar142) * fVar177;
                fStack_52c = fVar187 * (fVar176 * (fVar154 * fStack_4ec +
                                                  fVar108 * fStack_45c +
                                                  fVar109 * fStack_46c + fVar68 * fStack_47c) -
                                       fVar128 * fVar125) * fVar177;
                fStack_4b4 = (float)local_578._4_4_;
                fStack_4b0 = fStack_570;
                fStack_4ac = fStack_56c;
                if (fVar176 < 0.0) {
                  local_598._0_4_ = fVar107;
                  local_528 = fVar139 * fVar177;
                  fStack_524 = fVar140 * fVar177;
                  fStack_520 = fVar142 * fVar177;
                  fStack_51c = fVar125 * fVar177;
                  local_518 = -fVar139;
                  fStack_514 = -fVar140;
                  fStack_510 = -fVar142;
                  fStack_50c = -fVar125;
                  fVar176 = sqrtf(fVar176);
                  pRVar52 = extraout_RAX_01;
                  fVar68 = local_528;
                  fVar109 = fStack_524;
                  fVar154 = fStack_520;
                  fVar108 = fStack_51c;
                  fVar155 = local_518;
                  fVar156 = fStack_514;
                  fVar175 = fStack_510;
                  fVar177 = fStack_50c;
                  fVar107 = (float)local_598._0_4_;
                }
                else {
                  fVar176 = SQRT(fVar176);
                  fVar68 = fVar139 * fVar177;
                  fVar109 = fVar140 * fVar177;
                  fVar154 = fVar142 * fVar177;
                  fVar108 = fVar125 * fVar177;
                  fVar155 = -fVar139;
                  fVar156 = -fVar140;
                  fVar175 = -fVar142;
                  fVar177 = -fVar125;
                }
                fVar128 = fStack_554 * fVar109;
                fVar141 = fStack_550 * fVar154;
                fVar189 = fStack_54c * fVar108;
                fVar187 = fVar128 + local_558 * fVar68 + fVar141;
                fVar196 = fVar128 + fVar128 + fVar189;
                fVar141 = fVar128 + fVar141 + fVar141;
                fVar189 = fVar128 + fVar189 + fVar189;
                fVar128 = (fVar107 + 1.0) * ((float)local_578._0_4_ / fVar176) +
                          fVar107 * (float)local_578._0_4_ + local_4b8;
                fVar176 = fStack_55c * fVar108;
                fVar108 = fVar108 * fVar177;
                fVar107 = fVar154 * fVar175 + fVar109 * fVar156 + fVar68 * fVar155 +
                          fStack_530 * fStack_550 + fStack_534 * fStack_554 + local_538 * local_558;
                fVar68 = fStack_560 * fVar154 + fStack_564 * fVar109 + local_568 * fVar68;
                fVar188 = auVar250._0_4_ - fVar187 * fVar187;
                auVar100._0_8_ = CONCAT44(auVar250._4_4_ - fVar196 * fVar196,fVar188);
                auVar100._8_4_ = auVar250._8_4_ - fVar141 * fVar141;
                auVar100._12_4_ = auVar250._12_4_ - fVar189 * fVar189;
                fVar177 = fVar177 * fStack_54c;
                fVar109 = (fVar175 * fStack_550 + fVar156 * fStack_554 + fVar155 * local_558) -
                          fVar187 * fVar107;
                fStack_530 = fStack_560 * fStack_550;
                fStack_534 = fStack_55c * fStack_54c;
                local_538 = (fStack_530 + fStack_564 * fStack_554 + local_568 * local_558) -
                            fVar187 * fVar68;
                auVar148._8_4_ = auVar100._8_4_;
                auVar148._0_8_ = auVar100._0_8_;
                auVar148._12_4_ = auVar100._12_4_;
                auVar78 = rsqrtss(auVar148,auVar100);
                fVar155 = auVar78._0_4_;
                auVar149._4_12_ = auVar78._4_12_;
                auVar149._0_4_ = fVar155 * fVar155 * fVar188 * -0.5 * fVar155 + fVar155 * 1.5;
                fStack_52c = fStack_534;
                if (fVar188 < 0.0) {
                  local_598._0_4_ = fVar128;
                  _local_548 = auVar149;
                  local_528 = fVar107;
                  fStack_524 = fVar108;
                  fStack_520 = fVar154 * fVar175;
                  fStack_51c = fVar108;
                  local_518 = fVar109;
                  fStack_514 = fVar177;
                  fStack_510 = fVar175 * fStack_550;
                  fStack_50c = fVar177;
                  local_388 = fVar68;
                  fStack_384 = fVar176;
                  fStack_380 = fStack_560 * fVar154;
                  fStack_37c = fVar176;
                  local_378 = fVar187;
                  fStack_374 = fVar196;
                  fStack_370 = fVar141;
                  fStack_36c = fVar189;
                  fVar188 = sqrtf(fVar188);
                  pRVar52 = extraout_RAX_02;
                  auVar149 = _local_548;
                  fVar107 = local_528;
                  fVar108 = fStack_524;
                  fVar68 = local_388;
                  fVar176 = fStack_384;
                  fVar109 = local_518;
                  fVar177 = fStack_514;
                  fVar128 = (float)local_598._0_4_;
                  fVar187 = local_378;
                }
                else {
                  fVar188 = SQRT(fVar188);
                }
                fVar188 = fVar188 - fStack_33c;
                fVar109 = fVar109 * auVar149._0_4_ - fVar125;
                auVar18._4_4_ = fStack_534;
                auVar18._0_4_ = local_538;
                auVar18._8_4_ = fStack_530;
                auVar18._12_4_ = fStack_52c;
                auVar129._4_12_ = auVar18._4_12_;
                auVar129._0_4_ = local_538 * auVar149._0_4_;
                auVar236._0_8_ = CONCAT44(fVar177,fVar109) ^ 0x8000000080000000;
                auVar236._8_4_ = -fVar177;
                auVar236._12_4_ = fVar108;
                auVar235._8_8_ = auVar236._8_8_;
                auVar235._0_8_ = CONCAT44(fVar107,fVar109) ^ 0x80000000;
                fVar107 = fVar107 * auVar129._0_4_ - fVar68 * fVar109;
                auVar131._0_8_ = auVar129._0_8_;
                auVar131._8_4_ = fStack_534;
                auVar131._12_4_ = -fVar176;
                auVar130._8_8_ = auVar131._8_8_;
                auVar130._0_8_ = CONCAT44(fVar68,auVar129._0_4_) ^ 0x8000000000000000;
                auVar13._4_4_ = fVar107;
                auVar13._0_4_ = fVar107;
                auVar13._8_4_ = fVar107;
                auVar13._12_4_ = fVar107;
                auVar78 = divps(auVar130,auVar13);
                auVar14._4_4_ = fVar107;
                auVar14._0_4_ = fVar107;
                auVar14._8_4_ = fVar107;
                auVar14._12_4_ = fVar107;
                auVar244 = divps(auVar235,auVar14);
                fVar126 = fVar126 - (auVar78._4_4_ * fVar188 + auVar78._0_4_ * fVar187);
                auVar222._0_4_ = fVar127 - (auVar244._4_4_ * fVar188 + auVar244._0_4_ * fVar187);
                if (fVar128 <= ABS(fVar187)) {
                  bVar9 = false;
                }
                else if (local_398 * 1.9073486e-06 + local_4b8 + fVar128 <= ABS(fVar188)) {
                  bVar9 = false;
                }
                else {
                  auVar222._0_4_ = auVar222._0_4_ + (float)local_2c8._0_4_;
                  bVar9 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= auVar222._0_4_) &&
                       (fVar68 = (ray->super_RayK<1>).tfar, auVar222._0_4_ <= fVar68)) &&
                      (0.0 <= fVar126)) && (fVar126 <= 1.0)) {
                    auVar78 = rsqrtss(auVar250,auVar250);
                    fVar107 = auVar78._0_4_;
                    pGVar7 = (context->scene->geometries).items[(long)local_580].ptr;
                    uVar59 = (ray->super_RayK<1>).mask;
                    pRVar52 = (RayHit *)(ulong)uVar59;
                    pRVar55 = local_580;
                    if ((pGVar7->mask & uVar59) != 0) {
                      fVar107 = fVar107 * 1.5 + fVar107 * fVar107 * local_358 * -0.5 * fVar107;
                      fVar127 = local_558 * fVar107;
                      fVar155 = fStack_554 * fVar107;
                      fVar107 = fStack_550 * fVar107;
                      fVar109 = fVar125 * fVar127 + fVar139;
                      fVar108 = fVar125 * fVar155 + fVar140;
                      fVar125 = fVar125 * fVar107 + fVar142;
                      fVar154 = fVar155 * fVar139 - fVar140 * fVar127;
                      fVar140 = fVar107 * fVar140 - fVar142 * fVar155;
                      fVar127 = fVar127 * fVar142 - fVar139 * fVar107;
                      fVar107 = fVar108 * fVar140 - fVar127 * fVar109;
                      fVar108 = fVar125 * fVar127 - fVar154 * fVar108;
                      fVar109 = fVar109 * fVar154 - fVar140 * fVar125;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = auVar222._0_4_;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar109,fVar108);
                        (ray->Ng).field_0.field_0.z = fVar107;
                        ray->u = fVar126;
                        ray->v = 0.0;
                        ray->primID = (uint)local_500;
                        ray->geomID = (uint)local_580;
                        ray->instID[0] = context->user->instID[0];
                        uVar59 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar59;
                        pRVar52 = (RayHit *)(ulong)uVar59;
                      }
                      else {
                        local_458 = CONCAT44(fVar109,fVar108);
                        fStack_450 = fVar107;
                        fStack_44c = fVar126;
                        local_448 = 0;
                        local_444 = (uint)local_500;
                        local_440 = (uint)local_580;
                        local_43c = context->user->instID[0];
                        pRVar55 = (RTCIntersectArguments *)(ulong)local_43c;
                        local_438 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = auVar222._0_4_;
                        local_59c = 0xffffffff;
                        local_4e8.geometryUserPtr = pGVar7->userPtr;
                        local_4e8.valid = &local_59c;
                        local_4e8.context = context->user;
                        local_4e8.hit = (RTCHitN *)&local_458;
                        local_4e8.N = 1;
                        local_4e8.ray = (RTCRayN *)ray;
                        if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b76b39:
                          pRVar55 = context->args;
                          if (pRVar55->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar55->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar55->filter)(&local_4e8);
                            }
                            if ((((RayK<1> *)local_4e8.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00b76be1;
                          }
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_4e8.hit;
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_4e8.hit + 4);
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_4e8.hit + 8);
                          *(float *)((long)local_4e8.ray + 0x3c) = *(float *)(local_4e8.hit + 0xc);
                          *(float *)((long)local_4e8.ray + 0x40) = *(float *)(local_4e8.hit + 0x10);
                          *(float *)((long)local_4e8.ray + 0x44) = *(float *)(local_4e8.hit + 0x14);
                          *(float *)((long)local_4e8.ray + 0x48) = *(float *)(local_4e8.hit + 0x18);
                          *(float *)((long)local_4e8.ray + 0x4c) = *(float *)(local_4e8.hit + 0x1c);
                          pRVar55 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_4e8.hit + 0x20);
                          *(float *)((long)local_4e8.ray + 0x50) = *(float *)(local_4e8.hit + 0x20);
                          pRVar52 = (RayHit *)local_4e8.ray;
                        }
                        else {
                          (*pGVar7->intersectionFilterN)(&local_4e8);
                          if ((((RayK<1> *)local_4e8.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00b76b39;
LAB_00b76be1:
                          (ray->super_RayK<1>).tfar = fVar68;
                          pRVar52 = (RayHit *)local_4e8.valid;
                        }
                      }
                    }
                  }
                }
                bVar58 = lVar57 == 0;
                lVar57 = lVar57 + -1;
                pRVar51 = (RayHit *)CONCAT71((int7)((ulong)pRVar52 >> 8),bVar58);
              } while ((!bVar9) && (!bVar58));
              fVar126 = (ray->super_RayK<1>).tfar;
              local_2f8._0_4_ = -(uint)(local_3c8 <= fVar126) & local_2f8._0_4_;
              local_2f8._4_4_ = -(uint)(fStack_3c4 <= fVar126) & local_2f8._4_4_;
              local_2f8._8_4_ = -(uint)(fStack_3c0 <= fVar126) & local_2f8._8_4_;
              local_2f8._12_4_ = -(uint)(fStack_3bc <= fVar126) & local_2f8._12_4_;
              uVar53 = (undefined4)((ulong)pRVar52 >> 0x20);
              iVar47 = movmskps((int)pRVar51,local_2f8);
            } while (iVar47 != 0);
          }
          fVar126 = (ray->super_RayK<1>).tfar;
          local_418._0_4_ = -(uint)((float)local_418._0_4_ + local_3a8 <= fVar126) & local_2d8._0_4_
          ;
          local_418._4_4_ =
               -(uint)((float)local_418._4_4_ + fStack_3a4 <= fVar126) & local_2d8._4_4_;
          fStack_410 = (float)(-(uint)(fStack_410 + fStack_3a0 <= fVar126) & (uint)fStack_2d0);
          fStack_40c = (float)(-(uint)(fStack_40c + fStack_39c <= fVar126) & (uint)fStack_2cc);
          local_408._0_4_ =
               -(uint)((int)local_2e8 <
                      ((int)((local_408._0_4_ & local_428._0_4_) << 0x1f) >> 0x1f) + 4);
          local_408._4_4_ =
               -(uint)((int)fStack_2e4 <
                      ((int)((local_408._4_4_ & local_428._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_400 = (float)-(uint)((int)fStack_2e0 <
                                     ((int)(((uint)fStack_400 & (uint)fStack_420) << 0x1f) >> 0x1f)
                                     + 4);
          fStack_3fc = (float)-(uint)((int)fStack_2dc <
                                     ((int)(((uint)fStack_3fc & (uint)fStack_41c) << 0x1f) >> 0x1f)
                                     + 4);
          local_308 = ~_local_408 & _local_418;
          iVar47 = movmskps(iVar47,local_308);
          if (iVar47 != 0) {
            local_3b8 = _local_258;
            local_3c8 = local_3a8 + (float)local_258._0_4_;
            fStack_3c4 = fStack_3a4 + (float)local_258._4_4_;
            fStack_3c0 = fStack_3a0 + fStack_250;
            fStack_3bc = fStack_39c + fStack_24c;
            do {
              auVar244 = ~local_308 & _DAT_01feb9f0 | local_308 & local_3b8;
              auVar150._4_4_ = auVar244._0_4_;
              auVar150._0_4_ = auVar244._4_4_;
              auVar150._8_4_ = auVar244._12_4_;
              auVar150._12_4_ = auVar244._8_4_;
              auVar78 = minps(auVar150,auVar244);
              auVar121._0_8_ = auVar78._8_8_;
              auVar121._8_4_ = auVar78._0_4_;
              auVar121._12_4_ = auVar78._4_4_;
              auVar78 = minps(auVar121,auVar78);
              auVar122._0_8_ =
                   CONCAT44(-(uint)(auVar78._4_4_ == auVar244._4_4_) & local_308._4_4_,
                            -(uint)(auVar78._0_4_ == auVar244._0_4_) & local_308._0_4_);
              auVar122._8_4_ = -(uint)(auVar78._8_4_ == auVar244._8_4_) & local_308._8_4_;
              auVar122._12_4_ = -(uint)(auVar78._12_4_ == auVar244._12_4_) & local_308._12_4_;
              iVar47 = movmskps(iVar47,auVar122);
              auVar101 = local_308;
              if (iVar47 != 0) {
                auVar101._8_4_ = auVar122._8_4_;
                auVar101._0_8_ = auVar122._0_8_;
                auVar101._12_4_ = auVar122._12_4_;
              }
              uVar48 = movmskps(iVar47,auVar101);
              pRVar51 = (RayHit *)0x0;
              if (CONCAT44(uVar53,uVar48) != 0) {
                for (; (CONCAT44(uVar53,uVar48) >> (long)pRVar51 & 1) == 0;
                    pRVar51 = (RayHit *)((long)(pRVar51->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_308 + (long)pRVar51 * 4) = 0;
              fVar126 = local_2b8[(long)pRVar51];
              auVar223 = ZEXT416(*(uint *)(local_248 + (long)pRVar51 * 4));
              local_568 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fStack_564 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fStack_560 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fStack_55c = (ray->super_RayK<1>).dir.field_0.m128[3];
              fVar68 = fStack_560 * fStack_560 + fStack_564 * fStack_564 + local_568 * local_568;
              if (fVar68 < 0.0) {
                fVar68 = sqrtf(fVar68);
                pRVar51 = extraout_RAX_03;
              }
              else {
                fVar68 = SQRT(fVar68);
              }
              auVar21._4_4_ = fStack_4f4;
              auVar21._0_4_ = local_4f8;
              auVar21._8_4_ = fStack_4f0;
              auVar21._12_4_ = fStack_4ec;
              auVar27._4_4_ = fStack_464;
              auVar27._0_4_ = local_468;
              auVar27._8_4_ = fStack_460;
              auVar27._12_4_ = fStack_45c;
              auVar244 = minps(auVar21,auVar27);
              auVar218 = maxps(auVar21,auVar27);
              auVar25._4_4_ = fStack_474;
              auVar25._0_4_ = local_478;
              auVar25._8_4_ = fStack_470;
              auVar25._12_4_ = fStack_46c;
              auVar23._4_4_ = fStack_484;
              auVar23._0_4_ = local_488;
              auVar23._8_4_ = fStack_480;
              auVar23._12_4_ = fStack_47c;
              auVar78 = minps(auVar25,auVar23);
              auVar244 = minps(auVar244,auVar78);
              auVar78 = maxps(auVar25,auVar23);
              auVar78 = maxps(auVar218,auVar78);
              auVar167._0_8_ = auVar244._0_8_ & 0x7fffffff7fffffff;
              auVar167._8_4_ = auVar244._8_4_ & 0x7fffffff;
              auVar167._12_4_ = auVar244._12_4_ & 0x7fffffff;
              local_398 = auVar78._12_4_;
              auVar102._0_8_ = auVar78._0_8_ & 0x7fffffff7fffffff;
              auVar102._8_4_ = auVar78._8_4_ & 0x7fffffff;
              auVar102._12_4_ = ABS(local_398);
              auVar78 = maxps(auVar167,auVar102);
              fVar107 = auVar78._4_4_;
              if (auVar78._4_4_ <= auVar78._0_4_) {
                fVar107 = auVar78._0_4_;
              }
              auVar168._8_8_ = auVar78._8_8_;
              auVar168._0_8_ = auVar78._8_8_;
              if (auVar78._8_4_ <= fVar107) {
                auVar168._0_4_ = fVar107;
              }
              register0x00001304 = auVar168._4_12_;
              local_578._0_4_ = auVar168._0_4_ * 1.9073486e-06;
              local_368 = fVar68 * 1.9073486e-06;
              fStack_394 = local_398;
              fStack_390 = local_398;
              fStack_38c = local_398;
              lVar57 = 4;
              do {
                fVar68 = 1.0 - fVar126;
                fVar127 = local_468 * fVar68 + local_478 * fVar126;
                fVar140 = fStack_464 * fVar68 + fStack_474 * fVar126;
                fVar142 = fStack_460 * fVar68 + fStack_470 * fVar126;
                fVar154 = fStack_45c * fVar68 + fStack_46c * fVar126;
                fVar107 = (local_4f8 * fVar68 + local_468 * fVar126) * fVar68 + fVar126 * fVar127;
                fVar108 = (fStack_4f4 * fVar68 + fStack_464 * fVar126) * fVar68 + fVar126 * fVar140;
                fVar109 = (fStack_4f0 * fVar68 + fStack_460 * fVar126) * fVar68 + fVar126 * fVar142;
                fVar125 = (fStack_4ec * fVar68 + fStack_45c * fVar126) * fVar68 + fVar126 * fVar154;
                fVar139 = fVar127 * fVar68 + (local_478 * fVar68 + local_488 * fVar126) * fVar126;
                fVar140 = fVar140 * fVar68 + (fStack_474 * fVar68 + fStack_484 * fVar126) * fVar126;
                fVar142 = fVar142 * fVar68 + (fStack_470 * fVar68 + fStack_480 * fVar126) * fVar126;
                fVar154 = fVar154 * fVar68 + (fStack_46c * fVar68 + fStack_47c * fVar126) * fVar126;
                fVar127 = auVar223._0_4_;
                local_348._0_4_ = fVar68 * fVar107 + fVar126 * fVar139;
                local_348._4_4_ = fVar68 * fVar108 + fVar126 * fVar140;
                fStack_340 = fVar68 * fVar109 + fVar126 * fVar142;
                fStack_33c = fVar68 * fVar125 + fVar126 * fVar154;
                fVar139 = (fVar139 - fVar107) * 3.0;
                fVar140 = (fVar140 - fVar108) * 3.0;
                fVar142 = (fVar142 - fVar109) * 3.0;
                fVar125 = (fVar154 - fVar125) * 3.0;
                local_558 = (fVar127 * local_568 + 0.0) - (float)local_348._0_4_;
                fStack_554 = (fVar127 * fStack_564 + 0.0) - (float)local_348._4_4_;
                fStack_550 = (fVar127 * fStack_560 + 0.0) - fStack_340;
                fStack_54c = (fVar127 * fStack_55c + 0.0) - fStack_33c;
                fVar107 = fStack_554 * fStack_554;
                fVar108 = fStack_550 * fStack_550;
                fVar109 = fStack_54c * fStack_54c;
                auVar251._0_4_ = fVar107 + local_558 * local_558 + fVar108;
                auVar251._4_4_ = fVar107 + fVar107 + fVar109;
                auVar251._8_4_ = fVar107 + fVar108 + fVar108;
                auVar251._12_4_ = fVar107 + fVar109 + fVar109;
                local_358 = auVar251._0_4_;
                if (auVar251._0_4_ < 0.0) {
                  local_598 = ZEXT416((uint)fVar68);
                  fVar107 = sqrtf(auVar251._0_4_);
                  pRVar52 = extraout_RAX_04;
                  fVar68 = (float)local_598._0_4_;
                }
                else {
                  fVar107 = SQRT(auVar251._0_4_);
                  pRVar52 = pRVar51;
                }
                fVar154 = fVar68 * 6.0;
                fVar108 = (fVar126 - (fVar68 + fVar68)) * 6.0;
                fVar109 = (fVar68 - (fVar126 + fVar126)) * 6.0;
                fVar68 = fVar126 * 6.0;
                fVar155 = fVar154 * local_4f8 +
                          fVar108 * local_468 + fVar109 * local_478 + fVar68 * local_488;
                fVar156 = fVar154 * fStack_4f4 +
                          fVar108 * fStack_464 + fVar109 * fStack_474 + fVar68 * fStack_484;
                fVar175 = fVar154 * fStack_4f0 +
                          fVar108 * fStack_460 + fVar109 * fStack_470 + fVar68 * fStack_480;
                local_4b8 = (float)local_578._0_4_;
                if ((float)local_578._0_4_ <= local_368 * fVar127) {
                  local_4b8 = local_368 * fVar127;
                }
                fVar176 = fVar140 * fVar140 + fVar139 * fVar139 + fVar142 * fVar142;
                auVar244 = ZEXT416((uint)fVar176);
                auVar78 = rsqrtss(ZEXT416((uint)fVar176),auVar244);
                fVar177 = auVar78._0_4_;
                fVar177 = fVar177 * fVar177 * fVar176 * -0.5 * fVar177 + fVar177 * 1.5;
                fVar128 = fVar142 * fVar175 + fVar140 * fVar156 + fVar139 * fVar155;
                auVar78 = rcpss(auVar244,auVar244);
                fVar187 = (2.0 - fVar176 * auVar78._0_4_) * auVar78._0_4_;
                local_538 = fVar187 * (fVar176 * fVar155 - fVar128 * fVar139) * fVar177;
                fStack_534 = fVar187 * (fVar176 * fVar156 - fVar128 * fVar140) * fVar177;
                fStack_530 = fVar187 * (fVar176 * fVar175 - fVar128 * fVar142) * fVar177;
                fStack_52c = fVar187 * (fVar176 * (fVar154 * fStack_4ec +
                                                  fVar108 * fStack_45c +
                                                  fVar109 * fStack_46c + fVar68 * fStack_47c) -
                                       fVar128 * fVar125) * fVar177;
                fStack_4b4 = (float)local_578._4_4_;
                fStack_4b0 = fStack_570;
                fStack_4ac = fStack_56c;
                if (fVar176 < 0.0) {
                  local_598._0_4_ = fVar107;
                  local_528 = fVar139 * fVar177;
                  fStack_524 = fVar140 * fVar177;
                  fStack_520 = fVar142 * fVar177;
                  fStack_51c = fVar125 * fVar177;
                  local_518 = -fVar139;
                  fStack_514 = -fVar140;
                  fStack_510 = -fVar142;
                  fStack_50c = -fVar125;
                  fVar176 = sqrtf(fVar176);
                  pRVar52 = extraout_RAX_05;
                  fVar68 = local_528;
                  fVar109 = fStack_524;
                  fVar154 = fStack_520;
                  fVar108 = fStack_51c;
                  fVar155 = local_518;
                  fVar156 = fStack_514;
                  fVar175 = fStack_510;
                  fVar177 = fStack_50c;
                  fVar107 = (float)local_598._0_4_;
                }
                else {
                  fVar176 = SQRT(fVar176);
                  fVar68 = fVar139 * fVar177;
                  fVar109 = fVar140 * fVar177;
                  fVar154 = fVar142 * fVar177;
                  fVar108 = fVar125 * fVar177;
                  fVar155 = -fVar139;
                  fVar156 = -fVar140;
                  fVar175 = -fVar142;
                  fVar177 = -fVar125;
                }
                fVar128 = fStack_554 * fVar109;
                fVar141 = fStack_550 * fVar154;
                fVar189 = fStack_54c * fVar108;
                fVar187 = fVar128 + local_558 * fVar68 + fVar141;
                fVar196 = fVar128 + fVar128 + fVar189;
                fVar141 = fVar128 + fVar141 + fVar141;
                fVar189 = fVar128 + fVar189 + fVar189;
                fVar128 = (fVar107 + 1.0) * ((float)local_578._0_4_ / fVar176) +
                          fVar107 * (float)local_578._0_4_ + local_4b8;
                fVar176 = fStack_55c * fVar108;
                fVar108 = fVar108 * fVar177;
                fVar107 = fVar154 * fVar175 + fVar109 * fVar156 + fVar68 * fVar155 +
                          fStack_530 * fStack_550 + fStack_534 * fStack_554 + local_538 * local_558;
                fVar68 = fStack_560 * fVar154 + fStack_564 * fVar109 + local_568 * fVar68;
                fVar188 = auVar251._0_4_ - fVar187 * fVar187;
                auVar103._0_8_ = CONCAT44(auVar251._4_4_ - fVar196 * fVar196,fVar188);
                auVar103._8_4_ = auVar251._8_4_ - fVar141 * fVar141;
                auVar103._12_4_ = auVar251._12_4_ - fVar189 * fVar189;
                fVar177 = fVar177 * fStack_54c;
                fVar109 = (fVar175 * fStack_550 + fVar156 * fStack_554 + fVar155 * local_558) -
                          fVar187 * fVar107;
                fStack_530 = fStack_560 * fStack_550;
                fStack_534 = fStack_55c * fStack_54c;
                local_538 = (fStack_530 + fStack_564 * fStack_554 + local_568 * local_558) -
                            fVar187 * fVar68;
                auVar151._8_4_ = auVar103._8_4_;
                auVar151._0_8_ = auVar103._0_8_;
                auVar151._12_4_ = auVar103._12_4_;
                auVar78 = rsqrtss(auVar151,auVar103);
                fVar155 = auVar78._0_4_;
                auVar152._4_12_ = auVar78._4_12_;
                auVar152._0_4_ = fVar155 * fVar155 * fVar188 * -0.5 * fVar155 + fVar155 * 1.5;
                fStack_52c = fStack_534;
                if (fVar188 < 0.0) {
                  local_598._0_4_ = fVar128;
                  _local_548 = auVar152;
                  local_528 = fVar107;
                  fStack_524 = fVar108;
                  fStack_520 = fVar154 * fVar175;
                  fStack_51c = fVar108;
                  local_518 = fVar109;
                  fStack_514 = fVar177;
                  fStack_510 = fVar175 * fStack_550;
                  fStack_50c = fVar177;
                  local_388 = fVar68;
                  fStack_384 = fVar176;
                  fStack_380 = fStack_560 * fVar154;
                  fStack_37c = fVar176;
                  local_378 = fVar187;
                  fStack_374 = fVar196;
                  fStack_370 = fVar141;
                  fStack_36c = fVar189;
                  fVar188 = sqrtf(fVar188);
                  pRVar52 = extraout_RAX_06;
                  auVar152 = _local_548;
                  fVar107 = local_528;
                  fVar108 = fStack_524;
                  fVar68 = local_388;
                  fVar176 = fStack_384;
                  fVar109 = local_518;
                  fVar177 = fStack_514;
                  fVar128 = (float)local_598._0_4_;
                  fVar187 = local_378;
                }
                else {
                  fVar188 = SQRT(fVar188);
                }
                fVar188 = fVar188 - fStack_33c;
                fVar109 = fVar109 * auVar152._0_4_ - fVar125;
                auVar19._4_4_ = fStack_534;
                auVar19._0_4_ = local_538;
                auVar19._8_4_ = fStack_530;
                auVar19._12_4_ = fStack_52c;
                auVar132._4_12_ = auVar19._4_12_;
                auVar132._0_4_ = local_538 * auVar152._0_4_;
                auVar238._0_8_ = CONCAT44(fVar177,fVar109) ^ 0x8000000080000000;
                auVar238._8_4_ = -fVar177;
                auVar238._12_4_ = fVar108;
                auVar237._8_8_ = auVar238._8_8_;
                auVar237._0_8_ = CONCAT44(fVar107,fVar109) ^ 0x80000000;
                fVar107 = fVar107 * auVar132._0_4_ - fVar68 * fVar109;
                auVar134._0_8_ = auVar132._0_8_;
                auVar134._8_4_ = fStack_534;
                auVar134._12_4_ = -fVar176;
                auVar133._8_8_ = auVar134._8_8_;
                auVar133._0_8_ = CONCAT44(fVar68,auVar132._0_4_) ^ 0x8000000000000000;
                auVar15._4_4_ = fVar107;
                auVar15._0_4_ = fVar107;
                auVar15._8_4_ = fVar107;
                auVar15._12_4_ = fVar107;
                auVar78 = divps(auVar133,auVar15);
                auVar16._4_4_ = fVar107;
                auVar16._0_4_ = fVar107;
                auVar16._8_4_ = fVar107;
                auVar16._12_4_ = fVar107;
                auVar244 = divps(auVar237,auVar16);
                fVar126 = fVar126 - (auVar78._4_4_ * fVar188 + auVar78._0_4_ * fVar187);
                auVar223._0_4_ = fVar127 - (auVar244._4_4_ * fVar188 + auVar244._0_4_ * fVar187);
                if (fVar128 <= ABS(fVar187)) {
                  bVar9 = false;
                }
                else if (local_398 * 1.9073486e-06 + local_4b8 + fVar128 <= ABS(fVar188)) {
                  bVar9 = false;
                }
                else {
                  auVar223._0_4_ = auVar223._0_4_ + (float)local_2c8._0_4_;
                  bVar9 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= auVar223._0_4_) &&
                       (fVar68 = (ray->super_RayK<1>).tfar, auVar223._0_4_ <= fVar68)) &&
                      (0.0 <= fVar126)) && (fVar126 <= 1.0)) {
                    auVar78 = rsqrtss(auVar251,auVar251);
                    fVar107 = auVar78._0_4_;
                    pGVar7 = (context->scene->geometries).items[(long)local_580].ptr;
                    uVar59 = (ray->super_RayK<1>).mask;
                    pRVar52 = (RayHit *)(ulong)uVar59;
                    pRVar55 = local_580;
                    if ((pGVar7->mask & uVar59) != 0) {
                      fVar107 = fVar107 * 1.5 + fVar107 * fVar107 * local_358 * -0.5 * fVar107;
                      fVar127 = local_558 * fVar107;
                      fVar155 = fStack_554 * fVar107;
                      fVar107 = fStack_550 * fVar107;
                      fVar109 = fVar125 * fVar127 + fVar139;
                      fVar108 = fVar125 * fVar155 + fVar140;
                      fVar125 = fVar125 * fVar107 + fVar142;
                      fVar154 = fVar155 * fVar139 - fVar140 * fVar127;
                      fVar140 = fVar107 * fVar140 - fVar142 * fVar155;
                      fVar127 = fVar127 * fVar142 - fVar139 * fVar107;
                      fVar107 = fVar108 * fVar140 - fVar127 * fVar109;
                      fVar108 = fVar125 * fVar127 - fVar154 * fVar108;
                      fVar109 = fVar109 * fVar154 - fVar140 * fVar125;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = auVar223._0_4_;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar109,fVar108);
                        (ray->Ng).field_0.field_0.z = fVar107;
                        ray->u = fVar126;
                        ray->v = 0.0;
                        ray->primID = (uint)local_500;
                        ray->geomID = (uint)local_580;
                        ray->instID[0] = context->user->instID[0];
                        uVar59 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar59;
                        pRVar52 = (RayHit *)(ulong)uVar59;
                      }
                      else {
                        local_458 = CONCAT44(fVar109,fVar108);
                        fStack_450 = fVar107;
                        fStack_44c = fVar126;
                        local_448 = 0;
                        local_444 = (uint)local_500;
                        local_440 = (uint)local_580;
                        local_43c = context->user->instID[0];
                        pRVar55 = (RTCIntersectArguments *)(ulong)local_43c;
                        local_438 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = auVar223._0_4_;
                        local_59c = 0xffffffff;
                        local_4e8.geometryUserPtr = pGVar7->userPtr;
                        local_4e8.valid = &local_59c;
                        local_4e8.context = context->user;
                        local_4e8.hit = (RTCHitN *)&local_458;
                        local_4e8.N = 1;
                        local_4e8.ray = (RTCRayN *)ray;
                        if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b77612:
                          pRVar55 = context->args;
                          if (pRVar55->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar55->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar55->filter)(&local_4e8);
                            }
                            if ((((RayK<1> *)local_4e8.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00b776ba;
                          }
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_4e8.hit;
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_4e8.hit + 4);
                          (((Vec3f *)((long)local_4e8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_4e8.hit + 8);
                          *(float *)((long)local_4e8.ray + 0x3c) = *(float *)(local_4e8.hit + 0xc);
                          *(float *)((long)local_4e8.ray + 0x40) = *(float *)(local_4e8.hit + 0x10);
                          *(float *)((long)local_4e8.ray + 0x44) = *(float *)(local_4e8.hit + 0x14);
                          *(float *)((long)local_4e8.ray + 0x48) = *(float *)(local_4e8.hit + 0x18);
                          *(float *)((long)local_4e8.ray + 0x4c) = *(float *)(local_4e8.hit + 0x1c);
                          pRVar55 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_4e8.hit + 0x20);
                          *(float *)((long)local_4e8.ray + 0x50) = *(float *)(local_4e8.hit + 0x20);
                          pRVar52 = (RayHit *)local_4e8.ray;
                        }
                        else {
                          (*pGVar7->intersectionFilterN)(&local_4e8);
                          if ((((RayK<1> *)local_4e8.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00b77612;
LAB_00b776ba:
                          (ray->super_RayK<1>).tfar = fVar68;
                          pRVar52 = (RayHit *)local_4e8.valid;
                        }
                      }
                    }
                  }
                }
                bVar58 = lVar57 == 0;
                lVar57 = lVar57 + -1;
                pRVar51 = (RayHit *)CONCAT71((int7)((ulong)pRVar52 >> 8),bVar58);
              } while ((!bVar9) && (!bVar58));
              fVar126 = (ray->super_RayK<1>).tfar;
              local_308._0_4_ = -(uint)(local_3c8 <= fVar126) & local_308._0_4_;
              local_308._4_4_ = -(uint)(fStack_3c4 <= fVar126) & local_308._4_4_;
              local_308._8_4_ = -(uint)(fStack_3c0 <= fVar126) & local_308._8_4_;
              local_308._12_4_ = -(uint)(fStack_3bc <= fVar126) & local_308._12_4_;
              uVar53 = (undefined4)((ulong)pRVar52 >> 0x20);
              iVar47 = movmskps((int)pRVar51,local_308);
            } while (iVar47 != 0);
          }
          fVar126 = (ray->super_RayK<1>).tfar;
          auVar169._0_4_ =
               local_498._0_4_ & local_328._0_4_ &
               -(uint)(local_3a8 + (float)local_118._0_4_ <= fVar126);
          auVar169._4_4_ =
               local_498._4_4_ & local_328._4_4_ &
               -(uint)(fStack_3a4 + (float)local_118._4_4_ <= fVar126);
          auVar169._8_4_ =
               (uint)fStack_490 & (uint)fStack_320 & -(uint)(fStack_3a0 + fStack_110 <= fVar126);
          auVar169._12_4_ =
               (uint)fStack_48c & (uint)fStack_31c & -(uint)(fStack_39c + fStack_10c <= fVar126);
          auVar135._0_4_ =
               local_408._0_4_ & local_418._0_4_ &
               -(uint)(local_3a8 + (float)local_258._0_4_ <= fVar126);
          auVar135._4_4_ =
               local_408._4_4_ & local_418._4_4_ &
               -(uint)(fStack_3a4 + (float)local_258._4_4_ <= fVar126);
          auVar135._8_4_ =
               (uint)fStack_400 & (uint)fStack_410 & -(uint)(fStack_3a0 + fStack_250 <= fVar126);
          auVar135._12_4_ =
               (uint)fStack_3fc & (uint)fStack_40c & -(uint)(fStack_39c + fStack_24c <= fVar126);
          iVar47 = movmskps(iVar47,auVar135 | auVar169);
          if (iVar47 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar49 * 0xc) = auVar135 | auVar169;
            auVar104._0_4_ = local_118._0_4_ & auVar169._0_4_;
            auVar104._4_4_ = local_118._4_4_ & auVar169._4_4_;
            auVar104._8_4_ = (uint)fStack_110 & auVar169._8_4_;
            auVar104._12_4_ = (uint)fStack_10c & auVar169._12_4_;
            auVar170._0_4_ = ~auVar169._0_4_ & local_258._0_4_;
            auVar170._4_4_ = ~auVar169._4_4_ & local_258._4_4_;
            auVar170._8_4_ = ~auVar169._8_4_ & (uint)fStack_250;
            auVar170._12_4_ = ~auVar169._12_4_ & (uint)fStack_24c;
            *(undefined1 (*) [16])(afStack_e8 + uVar49 * 0xc) = auVar170 | auVar104;
            afStack_d0[uVar49 * 0xc + -2] = local_3f8;
            afStack_d0[uVar49 * 0xc + -1] = fStack_3f4;
            fVar126 = (float)((int)local_4a0 + 1);
            pRVar55 = (RTCIntersectArguments *)(ulong)(uint)fVar126;
            afStack_d0[uVar49 * 0xc] = fVar126;
            uVar56 = (ulong)((int)uVar49 + 1);
          }
        }
      }
    }
    fVar126 = (ray->super_RayK<1>).tfar;
    do {
      uVar59 = (uint)uVar56;
      if (uVar59 == 0) {
        fVar126 = (ray->super_RayK<1>).tfar;
        auVar124._4_4_ = -(uint)(fStack_234 <= fVar126);
        auVar124._0_4_ = -(uint)(local_238 <= fVar126);
        auVar124._8_4_ = -(uint)(fStack_230 <= fVar126);
        auVar124._12_4_ = -(uint)(fStack_22c <= fVar126);
        uVar59 = movmskps(0,auVar124);
        uVar59 = (uint)local_330 & uVar59;
        if (uVar59 == 0) {
          return;
        }
        goto LAB_00b75144;
      }
      uVar56 = (ulong)(uVar59 - 1);
      local_4e8.valid._0_4_ =
           -(uint)(local_3a8 + afStack_e8[uVar56 * 0xc] <= fVar126) & auStack_f8[uVar56 * 0xc];
      local_4e8.valid._4_4_ =
           -(uint)(fStack_3a4 + afStack_e8[uVar56 * 0xc + 1] <= fVar126) &
           auStack_f8[uVar56 * 0xc + 1];
      local_4e8.geometryUserPtr._0_4_ =
           -(uint)(fStack_3a0 + afStack_e8[uVar56 * 0xc + 2] <= fVar126) &
           auStack_f8[uVar56 * 0xc + 2];
      local_4e8.geometryUserPtr._4_4_ =
           -(uint)(fStack_39c + afStack_e8[uVar56 * 0xc + 3] <= fVar126) &
           (uint)afStack_e8[uVar56 * 0xc + -1];
      uVar61 = movmskps((int)pRVar55,(undefined1  [16])local_4e8._0_16_);
      pRVar55 = (RTCIntersectArguments *)(ulong)uVar61;
      if (uVar61 != 0) {
        auVar136._0_4_ = (uint)afStack_e8[uVar56 * 0xc] & (uint)local_4e8.valid;
        auVar136._4_4_ = (uint)afStack_e8[uVar56 * 0xc + 1] & local_4e8.valid._4_4_;
        auVar136._8_4_ = (uint)afStack_e8[uVar56 * 0xc + 2] & (uint)local_4e8.geometryUserPtr;
        auVar136._12_4_ = (uint)afStack_e8[uVar56 * 0xc + 3] & local_4e8.geometryUserPtr._4_4_;
        auVar153._0_8_ =
             CONCAT44(~local_4e8.valid._4_4_,~(uint)local_4e8.valid) & 0x7f8000007f800000;
        auVar153._8_4_ = ~(uint)local_4e8.geometryUserPtr & 0x7f800000;
        auVar153._12_4_ = ~local_4e8.geometryUserPtr._4_4_ & 0x7f800000;
        auVar153 = auVar153 | auVar136;
        auVar171._4_4_ = auVar153._0_4_;
        auVar171._0_4_ = auVar153._4_4_;
        auVar171._8_4_ = auVar153._12_4_;
        auVar171._12_4_ = auVar153._8_4_;
        auVar78 = minps(auVar171,auVar153);
        auVar137._0_8_ = auVar78._8_8_;
        auVar137._8_4_ = auVar78._0_4_;
        auVar137._12_4_ = auVar78._4_4_;
        auVar78 = minps(auVar137,auVar78);
        auVar138._0_8_ =
             CONCAT44(-(uint)(auVar78._4_4_ == auVar153._4_4_) & local_4e8.valid._4_4_,
                      -(uint)(auVar78._0_4_ == auVar153._0_4_) & (uint)local_4e8.valid);
        auVar138._8_4_ = -(uint)(auVar78._8_4_ == auVar153._8_4_) & (uint)local_4e8.geometryUserPtr;
        auVar138._12_4_ =
             -(uint)(auVar78._12_4_ == auVar153._12_4_) & local_4e8.geometryUserPtr._4_4_;
        iVar47 = movmskps((int)lVar50,auVar138);
        auVar123 = (undefined1  [16])local_4e8._0_16_;
        if (iVar47 != 0) {
          auVar123._8_4_ = auVar138._8_4_;
          auVar123._0_8_ = auVar138._0_8_;
          auVar123._12_4_ = auVar138._12_4_;
        }
        fVar68 = afStack_d0[uVar56 * 0xc + -2];
        fVar107 = afStack_d0[uVar56 * 0xc + -1];
        local_4a0 = (ulong)(uint)afStack_d0[uVar56 * 0xc];
        uVar63 = movmskps(afStack_d0[uVar56 * 0xc],auVar123);
        lVar50 = 0;
        if (uVar63 != 0) {
          for (; (uVar63 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
          }
        }
        *(undefined4 *)((long)&local_4e8.valid + lVar50 * 4) = 0;
        *(undefined1 (*) [16])(auStack_f8 + uVar56 * 0xc) = (undefined1  [16])local_4e8._0_16_;
        iVar47 = movmskps((int)(undefined1 (*) [16])(auStack_f8 + uVar56 * 0xc),
                          (undefined1  [16])local_4e8._0_16_);
        if (iVar47 == 0) {
          uVar59 = uVar59 - 1;
        }
        fVar107 = fVar107 - fVar68;
        local_458 = CONCAT44(fVar107 * 0.33333334 + fVar68,fVar107 * 0.0 + fVar68);
        fStack_450 = fVar107 * 0.6666667 + fVar68;
        fStack_44c = fVar107 * 1.0 + fVar68;
        local_3f8 = *(float *)((long)&local_458 + lVar50 * 4);
        fStack_3f4 = *(float *)((long)&local_458 + lVar50 * 4 + 4);
        uStack_3f0 = 0;
        uStack_3ec = 0;
        uVar56 = (ulong)uVar59;
      }
      uVar49 = uVar56;
    } while ((char)uVar61 == '\0');
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }